

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float fVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  RTCRayQueryContext *pRVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  ulong uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [12];
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  ulong uVar65;
  byte bVar66;
  ulong uVar67;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined8 in_R10;
  long lVar68;
  bool bVar69;
  undefined1 uVar70;
  undefined1 uVar71;
  uint uVar72;
  uint uVar136;
  uint uVar137;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar138;
  uint uVar142;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float pp;
  float fVar143;
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar156;
  undefined4 uVar157;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar164 [16];
  undefined1 auVar168 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar221 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [32];
  undefined1 auVar227 [16];
  undefined1 auVar231 [32];
  undefined1 auVar229 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [28];
  undefined1 auVar246 [64];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 in_ZMM31 [64];
  vfloat<8> dOdO;
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_ac8;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  RTCFilterFunctionNArguments local_8d0;
  undefined1 local_8a0 [32];
  undefined1 (*local_878) [32];
  Primitive *local_870;
  ulong local_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  RTCHitN local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  uVar67 = (ulong)(byte)prim[1];
  fVar5 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar78 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar79 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  fVar199 = fVar5 * auVar79._0_4_;
  fVar143 = fVar5 * auVar78._0_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar67 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar75);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar67 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar20);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar67 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar76);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar95 = vpmovsxbd_avx2(auVar6);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar67 * 0xc + 6);
  auVar96 = vpmovsxbd_avx2(auVar73);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar67 * 0xd + 6);
  auVar94 = vpmovsxbd_avx2(auVar86);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar67 * 0x12 + 6);
  auVar97 = vpmovsxbd_avx2(auVar81);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar67 * 0x13 + 6);
  auVar98 = vpmovsxbd_avx2(auVar74);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar67 * 0x14 + 6);
  auVar100 = vpmovsxbd_avx2(auVar77);
  auVar99 = vcvtdq2ps_avx(auVar100);
  auVar107._4_4_ = fVar143;
  auVar107._0_4_ = fVar143;
  auVar107._8_4_ = fVar143;
  auVar107._12_4_ = fVar143;
  auVar107._16_4_ = fVar143;
  auVar107._20_4_ = fVar143;
  auVar107._24_4_ = fVar143;
  auVar107._28_4_ = fVar143;
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  auVar90 = ZEXT1632(CONCAT412(fVar5 * auVar78._12_4_,
                               CONCAT48(fVar5 * auVar78._8_4_,
                                        CONCAT44(fVar5 * auVar78._4_4_,fVar143))));
  auVar89 = vpermps_avx2(auVar109,auVar90);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar88 = vpermps_avx512vl(auVar87,auVar90);
  fVar143 = auVar88._0_4_;
  auVar224._0_4_ = fVar143 * auVar92._0_4_;
  fVar169 = auVar88._4_4_;
  auVar224._4_4_ = fVar169 * auVar92._4_4_;
  fVar171 = auVar88._8_4_;
  auVar224._8_4_ = fVar171 * auVar92._8_4_;
  fVar173 = auVar88._12_4_;
  auVar224._12_4_ = fVar173 * auVar92._12_4_;
  fVar144 = auVar88._16_4_;
  auVar224._16_4_ = fVar144 * auVar92._16_4_;
  fVar175 = auVar88._20_4_;
  auVar224._20_4_ = fVar175 * auVar92._20_4_;
  fVar177 = auVar88._24_4_;
  auVar224._28_36_ = in_ZMM4._28_36_;
  auVar224._24_4_ = fVar177 * auVar92._24_4_;
  auVar90._4_4_ = auVar94._4_4_ * fVar169;
  auVar90._0_4_ = auVar94._0_4_ * fVar143;
  auVar90._8_4_ = auVar94._8_4_ * fVar171;
  auVar90._12_4_ = auVar94._12_4_ * fVar173;
  auVar90._16_4_ = auVar94._16_4_ * fVar144;
  auVar90._20_4_ = auVar94._20_4_ * fVar175;
  auVar90._24_4_ = auVar94._24_4_ * fVar177;
  auVar90._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar99._4_4_ * fVar169;
  auVar100._0_4_ = auVar99._0_4_ * fVar143;
  auVar100._8_4_ = auVar99._8_4_ * fVar171;
  auVar100._12_4_ = auVar99._12_4_ * fVar173;
  auVar100._16_4_ = auVar99._16_4_ * fVar144;
  auVar100._20_4_ = auVar99._20_4_ * fVar175;
  auVar100._24_4_ = auVar99._24_4_ * fVar177;
  auVar100._28_4_ = auVar88._28_4_;
  auVar75 = vfmadd231ps_fma(auVar224._0_32_,auVar89,auVar91);
  auVar20 = vfmadd231ps_fma(auVar90,auVar89,auVar96);
  auVar76 = vfmadd231ps_fma(auVar100,auVar98,auVar89);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar107,auVar93);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar107,auVar95);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar97,auVar107);
  auVar108._4_4_ = fVar199;
  auVar108._0_4_ = fVar199;
  auVar108._8_4_ = fVar199;
  auVar108._12_4_ = fVar199;
  auVar108._16_4_ = fVar199;
  auVar108._20_4_ = fVar199;
  auVar108._24_4_ = fVar199;
  auVar108._28_4_ = fVar199;
  auVar89 = ZEXT1632(CONCAT412(fVar5 * auVar79._12_4_,
                               CONCAT48(fVar5 * auVar79._8_4_,
                                        CONCAT44(fVar5 * auVar79._4_4_,fVar199))));
  auVar100 = vpermps_avx2(auVar109,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  auVar90 = vmulps_avx512vl(auVar89,auVar92);
  auVar102._0_4_ = auVar89._0_4_ * auVar94._0_4_;
  auVar102._4_4_ = auVar89._4_4_ * auVar94._4_4_;
  auVar102._8_4_ = auVar89._8_4_ * auVar94._8_4_;
  auVar102._12_4_ = auVar89._12_4_ * auVar94._12_4_;
  auVar102._16_4_ = auVar89._16_4_ * auVar94._16_4_;
  auVar102._20_4_ = auVar89._20_4_ * auVar94._20_4_;
  auVar102._24_4_ = auVar89._24_4_ * auVar94._24_4_;
  auVar102._28_4_ = 0;
  auVar94._4_4_ = auVar89._4_4_ * auVar99._4_4_;
  auVar94._0_4_ = auVar89._0_4_ * auVar99._0_4_;
  auVar94._8_4_ = auVar89._8_4_ * auVar99._8_4_;
  auVar94._12_4_ = auVar89._12_4_ * auVar99._12_4_;
  auVar94._16_4_ = auVar89._16_4_ * auVar99._16_4_;
  auVar94._20_4_ = auVar89._20_4_ * auVar99._20_4_;
  auVar94._24_4_ = auVar89._24_4_ * auVar99._24_4_;
  auVar94._28_4_ = auVar92._28_4_;
  auVar91 = vfmadd231ps_avx512vl(auVar90,auVar100,auVar91);
  auVar6 = vfmadd231ps_fma(auVar102,auVar100,auVar96);
  auVar73 = vfmadd231ps_fma(auVar94,auVar100,auVar98);
  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,auVar93);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar108,auVar95);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar108,auVar97);
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  auVar93 = vandps_avx(ZEXT1632(auVar75),auVar104);
  auVar106._8_4_ = 0x219392ef;
  auVar106._0_8_ = 0x219392ef219392ef;
  auVar106._12_4_ = 0x219392ef;
  auVar106._16_4_ = 0x219392ef;
  auVar106._20_4_ = 0x219392ef;
  auVar106._24_4_ = 0x219392ef;
  auVar106._28_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar93,auVar106,1);
  bVar69 = (bool)((byte)uVar65 & 1);
  auVar89._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._0_4_;
  bVar69 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._4_4_;
  bVar69 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._8_4_;
  bVar69 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar20),auVar104);
  uVar65 = vcmpps_avx512vl(auVar93,auVar106,1);
  bVar69 = (bool)((byte)uVar65 & 1);
  auVar87._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar20._0_4_;
  bVar69 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar20._4_4_;
  bVar69 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar20._8_4_;
  bVar69 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar20._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar76),auVar104);
  uVar65 = vcmpps_avx512vl(auVar93,auVar106,1);
  bVar69 = (bool)((byte)uVar65 & 1);
  auVar93._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar76._0_4_;
  bVar69 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar76._4_4_;
  bVar69 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar76._8_4_;
  bVar69 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar76._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar92 = vrcp14ps_avx512vl(auVar89);
  auVar105._8_4_ = 0x3f800000;
  auVar105._0_8_ = 0x3f8000003f800000;
  auVar105._12_4_ = 0x3f800000;
  auVar105._16_4_ = 0x3f800000;
  auVar105._20_4_ = 0x3f800000;
  auVar105._24_4_ = 0x3f800000;
  auVar105._28_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar89,auVar92,auVar105);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar87);
  auVar20 = vfnmadd213ps_fma(auVar87,auVar92,auVar105);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar93);
  auVar76 = vfnmadd213ps_fma(auVar93,auVar92,auVar105);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar92,auVar92);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx512vl(auVar93,auVar91);
  auVar97._4_4_ = auVar75._4_4_ * auVar93._4_4_;
  auVar97._0_4_ = auVar75._0_4_ * auVar93._0_4_;
  auVar97._8_4_ = auVar75._8_4_ * auVar93._8_4_;
  auVar97._12_4_ = auVar75._12_4_ * auVar93._12_4_;
  auVar97._16_4_ = auVar93._16_4_ * 0.0;
  auVar97._20_4_ = auVar93._20_4_ * 0.0;
  auVar97._24_4_ = auVar93._24_4_ * 0.0;
  auVar97._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx512vl(auVar93,auVar91);
  auVar103._0_4_ = auVar75._0_4_ * auVar93._0_4_;
  auVar103._4_4_ = auVar75._4_4_ * auVar93._4_4_;
  auVar103._8_4_ = auVar75._8_4_ * auVar93._8_4_;
  auVar103._12_4_ = auVar75._12_4_ * auVar93._12_4_;
  auVar103._16_4_ = auVar93._16_4_ * 0.0;
  auVar103._20_4_ = auVar93._20_4_ * 0.0;
  auVar103._24_4_ = auVar93._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 0xe + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar6));
  auVar94 = vpbroadcastd_avx512vl();
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar98._4_4_ = auVar20._4_4_ * auVar93._4_4_;
  auVar98._0_4_ = auVar20._0_4_ * auVar93._0_4_;
  auVar98._8_4_ = auVar20._8_4_ * auVar93._8_4_;
  auVar98._12_4_ = auVar20._12_4_ * auVar93._12_4_;
  auVar98._16_4_ = auVar93._16_4_ * 0.0;
  auVar98._20_4_ = auVar93._20_4_ * 0.0;
  auVar98._24_4_ = auVar93._24_4_ * 0.0;
  auVar98._28_4_ = auVar93._28_4_;
  auVar93 = vcvtdq2ps_avx(auVar91);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar6));
  auVar101._0_4_ = auVar20._0_4_ * auVar93._0_4_;
  auVar101._4_4_ = auVar20._4_4_ * auVar93._4_4_;
  auVar101._8_4_ = auVar20._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar20._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 0x15 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar73));
  auVar99._4_4_ = auVar93._4_4_ * auVar76._4_4_;
  auVar99._0_4_ = auVar93._0_4_ * auVar76._0_4_;
  auVar99._8_4_ = auVar93._8_4_ * auVar76._8_4_;
  auVar99._12_4_ = auVar93._12_4_ * auVar76._12_4_;
  auVar99._16_4_ = auVar93._16_4_ * 0.0;
  auVar99._20_4_ = auVar93._20_4_ * 0.0;
  auVar99._24_4_ = auVar93._24_4_ * 0.0;
  auVar99._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar73));
  auVar88._0_4_ = auVar76._0_4_ * auVar93._0_4_;
  auVar88._4_4_ = auVar76._4_4_ * auVar93._4_4_;
  auVar88._8_4_ = auVar76._8_4_ * auVar93._8_4_;
  auVar88._12_4_ = auVar76._12_4_ * auVar93._12_4_;
  auVar88._16_4_ = auVar93._16_4_ * 0.0;
  auVar88._20_4_ = auVar93._20_4_ * 0.0;
  auVar88._24_4_ = auVar93._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar97,auVar103);
  auVar91 = vpminsd_avx2(auVar98,auVar101);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91 = vpminsd_avx2(auVar99,auVar88);
  uVar157 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar92._4_4_ = uVar157;
  auVar92._0_4_ = uVar157;
  auVar92._8_4_ = uVar157;
  auVar92._12_4_ = uVar157;
  auVar92._16_4_ = uVar157;
  auVar92._20_4_ = uVar157;
  auVar92._24_4_ = uVar157;
  auVar92._28_4_ = uVar157;
  auVar91 = vmaxps_avx512vl(auVar91,auVar92);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_260 = vmulps_avx512vl(auVar93,auVar91);
  auVar93 = vpmaxsd_avx2(auVar97,auVar103);
  auVar91 = vpmaxsd_avx2(auVar98,auVar101);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar91 = vpmaxsd_avx2(auVar99,auVar88);
  uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar95._4_4_ = uVar157;
  auVar95._0_4_ = uVar157;
  auVar95._8_4_ = uVar157;
  auVar95._12_4_ = uVar157;
  auVar95._16_4_ = uVar157;
  auVar95._20_4_ = uVar157;
  auVar95._24_4_ = uVar157;
  auVar95._28_4_ = uVar157;
  auVar91 = vminps_avx512vl(auVar91,auVar95);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar96);
  uVar21 = vcmpps_avx512vl(local_260,auVar93,2);
  uVar24 = vpcmpgtd_avx512vl(auVar94,_DAT_01fb4ba0);
  local_868 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar21 & (byte)uVar24));
  local_878 = (undefined1 (*) [32])&local_300;
  local_460 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_870 = prim;
LAB_01a78a7f:
  if (local_868 == 0) {
    return;
  }
  lVar68 = 0;
  for (uVar65 = local_868; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    lVar68 = lVar68 + 1;
  }
  uVar7 = *(uint *)(prim + 2);
  uVar8 = *(uint *)(prim + lVar68 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar7].ptr;
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar8);
  p_Var11 = pGVar10[1].intersectionFilterN;
  lVar68 = *(long *)&pGVar10[1].time_range.upper;
  auVar75 = *(undefined1 (*) [16])(lVar68 + (long)p_Var11 * uVar65);
  auVar20 = *(undefined1 (*) [16])(lVar68 + (uVar65 + 1) * (long)p_Var11);
  auVar76 = *(undefined1 (*) [16])(lVar68 + (uVar65 + 2) * (long)p_Var11);
  local_868 = local_868 - 1 & local_868;
  auVar6 = *(undefined1 (*) [16])(lVar68 + (uVar65 + 3) * (long)p_Var11);
  if (local_868 != 0) {
    uVar67 = local_868 - 1 & local_868;
    for (uVar65 = local_868; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    }
    if (uVar67 != 0) {
      for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar86 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_500 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar73 = vunpcklps_avx512vl(local_500._0_16_,local_520._0_16_);
  _local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar77 = local_540._0_16_;
  local_770 = vinsertps_avx512f(auVar73,auVar77,0x28);
  auVar79._0_4_ = auVar75._0_4_ + auVar20._0_4_ + auVar76._0_4_ + auVar6._0_4_;
  auVar79._4_4_ = auVar75._4_4_ + auVar20._4_4_ + auVar76._4_4_ + auVar6._4_4_;
  auVar79._8_4_ = auVar75._8_4_ + auVar20._8_4_ + auVar76._8_4_ + auVar6._8_4_;
  auVar79._12_4_ = auVar75._12_4_ + auVar20._12_4_ + auVar76._12_4_ + auVar6._12_4_;
  auVar78._8_4_ = 0x3e800000;
  auVar78._0_8_ = 0x3e8000003e800000;
  auVar78._12_4_ = 0x3e800000;
  auVar73 = vmulps_avx512vl(auVar79,auVar78);
  auVar73 = vsubps_avx(auVar73,auVar86);
  auVar73 = vdpps_avx(auVar73,local_770,0x7f);
  local_780 = vdpps_avx(local_770,local_770,0x7f);
  fVar5 = *(float *)(ray + k * 4 + 0x60);
  auVar82._4_12_ = ZEXT812(0) << 0x20;
  auVar82._0_4_ = local_780._0_4_;
  auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar82);
  auVar81 = vfnmadd213ss_fma(auVar74,local_780,ZEXT416(0x40000000));
  local_240 = auVar73._0_4_ * auVar74._0_4_ * auVar81._0_4_;
  auVar83._4_4_ = local_240;
  auVar83._0_4_ = local_240;
  auVar83._8_4_ = local_240;
  auVar83._12_4_ = local_240;
  fStack_730 = local_240;
  _local_740 = auVar83;
  fStack_72c = local_240;
  fStack_728 = local_240;
  fStack_724 = local_240;
  auVar73 = vfmadd231ps_fma(auVar86,local_770,auVar83);
  auVar73 = vblendps_avx(auVar73,ZEXT816(0) << 0x40,8);
  auVar75 = vsubps_avx(auVar75,auVar73);
  auVar76 = vsubps_avx(auVar76,auVar73);
  auVar20 = vsubps_avx(auVar20,auVar73);
  auVar6 = vsubps_avx(auVar6,auVar73);
  uVar157 = auVar75._0_4_;
  local_800._4_4_ = uVar157;
  local_800._0_4_ = uVar157;
  local_800._8_4_ = uVar157;
  local_800._12_4_ = uVar157;
  local_800._16_4_ = uVar157;
  local_800._20_4_ = uVar157;
  local_800._24_4_ = uVar157;
  local_800._28_4_ = uVar157;
  auVar244 = ZEXT3264(local_800);
  auVar111._8_4_ = 1;
  auVar111._0_8_ = 0x100000001;
  auVar111._12_4_ = 1;
  auVar111._16_4_ = 1;
  auVar111._20_4_ = 1;
  auVar111._24_4_ = 1;
  auVar111._28_4_ = 1;
  local_600 = ZEXT1632(auVar75);
  local_820 = vpermps_avx2(auVar111,local_600);
  auVar250 = ZEXT3264(local_820);
  auVar112._8_4_ = 2;
  auVar112._0_8_ = 0x200000002;
  auVar112._12_4_ = 2;
  auVar112._16_4_ = 2;
  auVar112._20_4_ = 2;
  auVar112._24_4_ = 2;
  auVar112._28_4_ = 2;
  local_840 = vpermps_avx2(auVar112,local_600);
  auVar252 = ZEXT3264(local_840);
  auVar113._8_4_ = 3;
  auVar113._0_8_ = 0x300000003;
  auVar113._12_4_ = 3;
  auVar113._16_4_ = 3;
  auVar113._20_4_ = 3;
  auVar113._24_4_ = 3;
  auVar113._28_4_ = 3;
  local_7a0 = vpermps_avx2(auVar113,local_600);
  uVar157 = auVar20._0_4_;
  local_7c0._4_4_ = uVar157;
  local_7c0._0_4_ = uVar157;
  local_7c0._8_4_ = uVar157;
  local_7c0._12_4_ = uVar157;
  local_7c0._16_4_ = uVar157;
  local_7c0._20_4_ = uVar157;
  local_7c0._24_4_ = uVar157;
  local_7c0._28_4_ = uVar157;
  auVar236 = ZEXT3264(local_7c0);
  local_640 = ZEXT1632(auVar20);
  local_7e0 = vpermps_avx2(auVar111,local_640);
  local_860 = vpermps_avx2(auVar112,local_640);
  auVar253 = ZEXT3264(local_860);
  auVar93 = vpermps_avx512vl(auVar113,local_640);
  auVar243 = ZEXT3264(local_7e0);
  auVar91 = vbroadcastss_avx512vl(auVar76);
  local_620 = ZEXT1632(auVar76);
  auVar92 = vpermps_avx512vl(auVar111,local_620);
  auVar95 = vpermps_avx512vl(auVar112,local_620);
  auVar96 = vpermps_avx512vl(auVar113,local_620);
  auVar241 = ZEXT3264(local_7a0);
  auVar94 = vbroadcastss_avx512vl(auVar6);
  _local_660 = ZEXT1632(auVar6);
  auVar97 = vpermps_avx512vl(auVar111,_local_660);
  auVar98 = vpermps_avx512vl(auVar112,_local_660);
  auVar99 = vpermps_avx512vl(auVar113,_local_660);
  auVar75 = vmulss_avx512f(auVar77,auVar77);
  auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),local_520,local_520);
  auVar100 = vfmadd231ps_avx512vl(auVar100,local_500,local_500);
  auVar100 = vbroadcastss_avx512vl(auVar100._0_16_);
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar100,auVar110);
  local_220 = auVar100;
  local_6e0 = ZEXT416((uint)local_240);
  local_240 = fVar5 - local_240;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  local_400 = vpbroadcastd_avx512vl();
  uVar65 = 0;
  local_ac8 = 1;
  local_420 = vpbroadcastd_avx512vl();
  auVar75 = vsqrtss_avx(local_780,local_780);
  auVar20 = vsqrtss_avx(local_780,local_780);
  auVar246 = ZEXT3264(local_860);
  local_470 = ZEXT816(0x3f80000000000000);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar255 = ZEXT3264(auVar89);
  auVar224 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar76 = vmovshdup_avx(local_470);
    auVar76 = vsubps_avx(auVar76,local_470);
    fVar175 = auVar76._0_4_;
    fVar144 = fVar175 * 0.04761905;
    auVar194._0_4_ = local_470._0_4_;
    auVar194._4_4_ = auVar194._0_4_;
    auVar194._8_4_ = auVar194._0_4_;
    auVar194._12_4_ = auVar194._0_4_;
    auVar194._16_4_ = auVar194._0_4_;
    auVar194._20_4_ = auVar194._0_4_;
    auVar194._24_4_ = auVar194._0_4_;
    auVar194._28_4_ = auVar194._0_4_;
    auVar213._4_4_ = fVar175;
    auVar213._0_4_ = fVar175;
    auVar213._8_4_ = fVar175;
    auVar213._12_4_ = fVar175;
    auVar213._16_4_ = fVar175;
    auVar213._20_4_ = fVar175;
    auVar213._24_4_ = fVar175;
    auVar213._28_4_ = fVar175;
    auVar76 = vfmadd231ps_fma(auVar194,auVar213,auVar224._0_32_);
    auVar254 = auVar255._0_32_;
    auVar89 = vsubps_avx512vl(auVar254,ZEXT1632(auVar76));
    fVar143 = auVar76._0_4_;
    fVar169 = auVar76._4_4_;
    auVar119._4_4_ = auVar236._4_4_ * fVar169;
    auVar119._0_4_ = auVar236._0_4_ * fVar143;
    fVar171 = auVar76._8_4_;
    auVar119._8_4_ = auVar236._8_4_ * fVar171;
    fVar173 = auVar76._12_4_;
    auVar119._12_4_ = auVar236._12_4_ * fVar173;
    auVar119._16_4_ = auVar236._16_4_ * 0.0;
    auVar119._20_4_ = auVar236._20_4_ * 0.0;
    auVar119._24_4_ = auVar236._24_4_ * 0.0;
    auVar119._28_4_ = auVar194._0_4_;
    auVar221._4_4_ = auVar243._4_4_ * fVar169;
    auVar221._0_4_ = auVar243._0_4_ * fVar143;
    auVar221._8_4_ = auVar243._8_4_ * fVar171;
    auVar221._12_4_ = auVar243._12_4_ * fVar173;
    auVar221._16_4_ = auVar243._16_4_ * 0.0;
    auVar221._20_4_ = auVar243._20_4_ * 0.0;
    auVar221._24_4_ = auVar243._24_4_ * 0.0;
    auVar221._28_4_ = fVar175;
    auVar225._0_4_ = auVar246._0_4_ * fVar143;
    auVar225._4_4_ = auVar246._4_4_ * fVar169;
    auVar225._8_4_ = auVar246._8_4_ * fVar171;
    auVar225._12_4_ = auVar246._12_4_ * fVar173;
    auVar225._16_4_ = auVar246._16_4_ * 0.0;
    auVar225._20_4_ = auVar246._20_4_ * 0.0;
    auVar225._28_36_ = auVar224._28_36_;
    auVar225._24_4_ = auVar246._24_4_ * 0.0;
    auVar90 = vmulps_avx512vl(auVar93,ZEXT1632(auVar76));
    auVar6 = vfmadd231ps_fma(auVar119,auVar89,auVar244._0_32_);
    auVar73 = vfmadd231ps_fma(auVar221,auVar89,auVar250._0_32_);
    auVar86 = vfmadd231ps_fma(auVar225._0_32_,auVar89,auVar252._0_32_);
    auVar81 = vfmadd231ps_fma(auVar90,auVar89,auVar241._0_32_);
    auVar90 = vmulps_avx512vl(auVar91,ZEXT1632(auVar76));
    auVar103 = ZEXT1632(auVar76);
    auVar87 = vmulps_avx512vl(auVar92,auVar103);
    auVar88 = vmulps_avx512vl(auVar95,auVar103);
    auVar101 = vmulps_avx512vl(auVar96,auVar103);
    auVar74 = vfmadd231ps_fma(auVar90,auVar89,auVar236._0_32_);
    auVar77 = vfmadd231ps_fma(auVar87,auVar89,auVar243._0_32_);
    auVar78 = vfmadd231ps_fma(auVar88,auVar89,auVar246._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar101,auVar89,auVar93);
    auVar87 = vmulps_avx512vl(auVar94,auVar103);
    auVar88 = vmulps_avx512vl(auVar97,auVar103);
    auVar101 = vmulps_avx512vl(auVar98,auVar103);
    auVar102 = vmulps_avx512vl(auVar99,auVar103);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar91);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar89,auVar92);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar89,auVar95);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar89,auVar96);
    auVar236._28_36_ = auVar253._28_36_;
    auVar236._0_28_ =
         ZEXT1628(CONCAT412(fVar173 * auVar74._12_4_,
                            CONCAT48(fVar171 * auVar74._8_4_,
                                     CONCAT44(fVar169 * auVar74._4_4_,fVar143 * auVar74._0_4_))));
    auVar103 = vmulps_avx512vl(auVar103,ZEXT1632(auVar77));
    auVar104 = vmulps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar78));
    auVar105 = vmulps_avx512vl(ZEXT1632(auVar76),auVar90);
    auVar76 = vfmadd231ps_fma(auVar236._0_32_,auVar89,ZEXT1632(auVar6));
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar89,ZEXT1632(auVar73));
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar89,ZEXT1632(auVar86));
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar89,ZEXT1632(auVar81));
    auVar235._0_4_ = auVar87._0_4_ * fVar143;
    auVar235._4_4_ = auVar87._4_4_ * fVar169;
    auVar235._8_4_ = auVar87._8_4_ * fVar171;
    auVar235._12_4_ = auVar87._12_4_ * fVar173;
    auVar235._16_4_ = auVar87._16_4_ * 0.0;
    auVar235._20_4_ = auVar87._20_4_ * 0.0;
    auVar235._24_4_ = auVar87._24_4_ * 0.0;
    auVar235._28_4_ = 0;
    auVar120._4_4_ = auVar88._4_4_ * fVar169;
    auVar120._0_4_ = auVar88._0_4_ * fVar143;
    auVar120._8_4_ = auVar88._8_4_ * fVar171;
    auVar120._12_4_ = auVar88._12_4_ * fVar173;
    auVar120._16_4_ = auVar88._16_4_ * 0.0;
    auVar120._20_4_ = auVar88._20_4_ * 0.0;
    auVar120._24_4_ = auVar88._24_4_ * 0.0;
    auVar120._28_4_ = auVar87._28_4_;
    auVar121._4_4_ = auVar101._4_4_ * fVar169;
    auVar121._0_4_ = auVar101._0_4_ * fVar143;
    auVar121._8_4_ = auVar101._8_4_ * fVar171;
    auVar121._12_4_ = auVar101._12_4_ * fVar173;
    auVar121._16_4_ = auVar101._16_4_ * 0.0;
    auVar121._20_4_ = auVar101._20_4_ * 0.0;
    auVar121._24_4_ = auVar101._24_4_ * 0.0;
    auVar121._28_4_ = auVar88._28_4_;
    auVar122._4_4_ = auVar102._4_4_ * fVar169;
    auVar122._0_4_ = auVar102._0_4_ * fVar143;
    auVar122._8_4_ = auVar102._8_4_ * fVar171;
    auVar122._12_4_ = auVar102._12_4_ * fVar173;
    auVar122._16_4_ = auVar102._16_4_ * 0.0;
    auVar122._20_4_ = auVar102._20_4_ * 0.0;
    auVar122._24_4_ = auVar102._24_4_ * 0.0;
    auVar122._28_4_ = auVar101._28_4_;
    auVar6 = vfmadd231ps_fma(auVar235,auVar89,ZEXT1632(auVar74));
    auVar73 = vfmadd231ps_fma(auVar120,auVar89,ZEXT1632(auVar77));
    auVar86 = vfmadd231ps_fma(auVar121,auVar89,ZEXT1632(auVar78));
    auVar81 = vfmadd231ps_fma(auVar122,auVar89,auVar90);
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar173 * auVar6._12_4_,
                                                 CONCAT48(fVar171 * auVar6._8_4_,
                                                          CONCAT44(fVar169 * auVar6._4_4_,
                                                                   fVar143 * auVar6._0_4_)))),
                              auVar89,ZEXT1632(auVar76));
    auVar106 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar73._12_4_ * fVar173,
                                             CONCAT48(auVar73._8_4_ * fVar171,
                                                      CONCAT44(auVar73._4_4_ * fVar169,
                                                               auVar73._0_4_ * fVar143)))),auVar89,
                          auVar103);
    auVar107 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar86._12_4_ * fVar173,
                                             CONCAT48(auVar86._8_4_ * fVar171,
                                                      CONCAT44(auVar86._4_4_ * fVar169,
                                                               auVar86._0_4_ * fVar143)))),auVar89,
                          auVar104);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar173,
                                            CONCAT48(auVar81._8_4_ * fVar171,
                                                     CONCAT44(auVar81._4_4_ * fVar169,
                                                              auVar81._0_4_ * fVar143)))),auVar105,
                         auVar89);
    auVar89 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar76));
    auVar87 = vsubps_avx512vl(ZEXT1632(auVar73),auVar103);
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar86),auVar104);
    auVar101 = vsubps_avx512vl(ZEXT1632(auVar81),auVar105);
    auVar247._0_4_ = fVar144 * auVar89._0_4_ * 3.0;
    auVar247._4_4_ = fVar144 * auVar89._4_4_ * 3.0;
    auVar247._8_4_ = fVar144 * auVar89._8_4_ * 3.0;
    auVar247._12_4_ = fVar144 * auVar89._12_4_ * 3.0;
    auVar247._16_4_ = fVar144 * auVar89._16_4_ * 3.0;
    auVar247._20_4_ = fVar144 * auVar89._20_4_ * 3.0;
    auVar247._24_4_ = fVar144 * auVar89._24_4_ * 3.0;
    auVar247._28_4_ = 0;
    auVar251._0_4_ = fVar144 * auVar87._0_4_ * 3.0;
    auVar251._4_4_ = fVar144 * auVar87._4_4_ * 3.0;
    auVar251._8_4_ = fVar144 * auVar87._8_4_ * 3.0;
    auVar251._12_4_ = fVar144 * auVar87._12_4_ * 3.0;
    auVar251._16_4_ = fVar144 * auVar87._16_4_ * 3.0;
    auVar251._20_4_ = fVar144 * auVar87._20_4_ * 3.0;
    auVar251._24_4_ = fVar144 * auVar87._24_4_ * 3.0;
    auVar251._28_4_ = 0;
    auVar125._4_4_ = fVar144 * auVar88._4_4_ * 3.0;
    auVar125._0_4_ = fVar144 * auVar88._0_4_ * 3.0;
    auVar125._8_4_ = fVar144 * auVar88._8_4_ * 3.0;
    auVar125._12_4_ = fVar144 * auVar88._12_4_ * 3.0;
    auVar125._16_4_ = fVar144 * auVar88._16_4_ * 3.0;
    auVar125._20_4_ = fVar144 * auVar88._20_4_ * 3.0;
    auVar125._24_4_ = fVar144 * auVar88._24_4_ * 3.0;
    auVar125._28_4_ = auVar102._28_4_;
    fVar143 = auVar101._0_4_ * 3.0 * fVar144;
    fVar169 = auVar101._4_4_ * 3.0 * fVar144;
    auVar126._4_4_ = fVar169;
    auVar126._0_4_ = fVar143;
    fVar171 = auVar101._8_4_ * 3.0 * fVar144;
    auVar126._8_4_ = fVar171;
    fVar173 = auVar101._12_4_ * 3.0 * fVar144;
    auVar126._12_4_ = fVar173;
    fVar175 = auVar101._16_4_ * 3.0 * fVar144;
    auVar126._16_4_ = fVar175;
    fVar177 = auVar101._20_4_ * 3.0 * fVar144;
    auVar126._20_4_ = fVar177;
    fVar199 = auVar101._24_4_ * 3.0 * fVar144;
    auVar126._24_4_ = fVar199;
    auVar126._28_4_ = fVar144;
    auVar76 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar76);
    auVar102 = vpermt2ps_avx512vl(ZEXT1632(auVar74),_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar103 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar87 = ZEXT1632(auVar76);
    auVar104 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,auVar87);
    auVar230._0_4_ = auVar90._0_4_ + fVar143;
    auVar230._4_4_ = auVar90._4_4_ + fVar169;
    auVar230._8_4_ = auVar90._8_4_ + fVar171;
    auVar230._12_4_ = auVar90._12_4_ + fVar173;
    auVar230._16_4_ = auVar90._16_4_ + fVar175;
    auVar230._20_4_ = auVar90._20_4_ + fVar177;
    auVar230._24_4_ = auVar90._24_4_ + fVar199;
    auVar230._28_4_ = auVar90._28_4_ + fVar144;
    auVar89 = vmaxps_avx(auVar90,auVar230);
    auVar105 = vminps_avx512vl(auVar90,auVar230);
    auVar108 = vpermt2ps_avx512vl(auVar90,_DAT_01fb9fc0,auVar87);
    auVar109 = vpermt2ps_avx512vl(auVar247,_DAT_01fb9fc0,auVar87);
    auVar110 = vpermt2ps_avx512vl(auVar251,_DAT_01fb9fc0,auVar87);
    auVar120 = ZEXT1632(auVar76);
    auVar111 = vpermt2ps_avx512vl(auVar125,_DAT_01fb9fc0,auVar120);
    auVar90 = vpermt2ps_avx512vl(auVar126,_DAT_01fb9fc0,auVar120);
    auVar90 = vsubps_avx(auVar108,auVar90);
    auVar87 = vsubps_avx(auVar102,ZEXT1632(auVar74));
    auVar88 = vsubps_avx(auVar103,auVar106);
    auVar101 = vsubps_avx(auVar104,auVar107);
    auVar112 = vmulps_avx512vl(auVar88,auVar125);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar251,auVar101);
    auVar113 = vmulps_avx512vl(auVar101,auVar247);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar125,auVar87);
    auVar114 = vmulps_avx512vl(auVar87,auVar251);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar247,auVar88);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar113 = vmulps_avx512vl(auVar101,auVar101);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar88,auVar88);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar87,auVar87);
    auVar114 = vrcp14ps_avx512vl(auVar113);
    auVar115 = vfnmadd213ps_avx512vl(auVar114,auVar113,auVar254);
    auVar114 = vfmadd132ps_avx512vl(auVar115,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar112,auVar114);
    auVar115 = vmulps_avx512vl(auVar88,auVar111);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar110,auVar101);
    auVar116 = vmulps_avx512vl(auVar101,auVar109);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar111,auVar87);
    auVar117 = vmulps_avx512vl(auVar87,auVar110);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar109,auVar88);
    auVar117 = vmulps_avx512vl(auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vmulps_avx512vl(auVar115,auVar114);
    auVar112 = vmaxps_avx512vl(auVar112,auVar114);
    auVar112 = vsqrtps_avx512vl(auVar112);
    auVar114 = vmaxps_avx512vl(auVar90,auVar108);
    auVar89 = vmaxps_avx512vl(auVar89,auVar114);
    auVar117 = vaddps_avx512vl(auVar112,auVar89);
    auVar89 = vminps_avx(auVar90,auVar108);
    auVar89 = vminps_avx512vl(auVar105,auVar89);
    auVar89 = vsubps_avx512vl(auVar89,auVar112);
    auVar114._8_4_ = 0x3f800002;
    auVar114._0_8_ = 0x3f8000023f800002;
    auVar114._12_4_ = 0x3f800002;
    auVar114._16_4_ = 0x3f800002;
    auVar114._20_4_ = 0x3f800002;
    auVar114._24_4_ = 0x3f800002;
    auVar114._28_4_ = 0x3f800002;
    auVar90 = vmulps_avx512vl(auVar117,auVar114);
    auVar115._8_4_ = 0x3f7ffffc;
    auVar115._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar115._12_4_ = 0x3f7ffffc;
    auVar115._16_4_ = 0x3f7ffffc;
    auVar115._20_4_ = 0x3f7ffffc;
    auVar115._24_4_ = 0x3f7ffffc;
    auVar115._28_4_ = 0x3f7ffffc;
    local_8a0 = vmulps_avx512vl(auVar89,auVar115);
    auVar89 = vmulps_avx512vl(auVar90,auVar90);
    auVar90 = vrsqrt14ps_avx512vl(auVar113);
    auVar116._8_4_ = 0xbf000000;
    auVar116._0_8_ = 0xbf000000bf000000;
    auVar116._12_4_ = 0xbf000000;
    auVar116._16_4_ = 0xbf000000;
    auVar116._20_4_ = 0xbf000000;
    auVar116._24_4_ = 0xbf000000;
    auVar116._28_4_ = 0xbf000000;
    auVar105 = vmulps_avx512vl(auVar113,auVar116);
    fVar143 = auVar90._0_4_;
    fVar169 = auVar90._4_4_;
    fVar171 = auVar90._8_4_;
    fVar173 = auVar90._12_4_;
    fVar144 = auVar90._16_4_;
    fVar175 = auVar90._20_4_;
    fVar177 = auVar90._24_4_;
    auVar41._4_4_ = fVar169 * fVar169 * fVar169 * auVar105._4_4_;
    auVar41._0_4_ = fVar143 * fVar143 * fVar143 * auVar105._0_4_;
    auVar41._8_4_ = fVar171 * fVar171 * fVar171 * auVar105._8_4_;
    auVar41._12_4_ = fVar173 * fVar173 * fVar173 * auVar105._12_4_;
    auVar41._16_4_ = fVar144 * fVar144 * fVar144 * auVar105._16_4_;
    auVar41._20_4_ = fVar175 * fVar175 * fVar175 * auVar105._20_4_;
    auVar41._24_4_ = fVar177 * fVar177 * fVar177 * auVar105._24_4_;
    auVar41._28_4_ = auVar117._28_4_;
    auVar117._8_4_ = 0x3fc00000;
    auVar117._0_8_ = 0x3fc000003fc00000;
    auVar117._12_4_ = 0x3fc00000;
    auVar117._16_4_ = 0x3fc00000;
    auVar117._20_4_ = 0x3fc00000;
    auVar117._24_4_ = 0x3fc00000;
    auVar117._28_4_ = 0x3fc00000;
    auVar90 = vfmadd231ps_avx512vl(auVar41,auVar90,auVar117);
    auVar253 = ZEXT3264(auVar90);
    auVar105 = vmulps_avx512vl(auVar87,auVar90);
    auVar108 = vmulps_avx512vl(auVar88,auVar90);
    auVar112 = vmulps_avx512vl(auVar101,auVar90);
    auVar221 = ZEXT1632(auVar74);
    auVar113 = vsubps_avx512vl(auVar120,auVar221);
    auVar114 = vsubps_avx512vl(auVar120,auVar106);
    auVar115 = vsubps_avx512vl(auVar120,auVar107);
    auVar116 = vmulps_avx512vl(_local_540,auVar115);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_520,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_500,auVar113);
    auVar117 = vmulps_avx512vl(auVar115,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar113);
    auVar118 = vmulps_avx512vl(_local_540,auVar112);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar108,local_520);
    auVar119 = vfmadd231ps_avx512vl(auVar118,auVar105,local_500);
    auVar112 = vmulps_avx512vl(auVar115,auVar112);
    auVar108 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar108);
    auVar105 = vfmadd231ps_avx512vl(auVar108,auVar113,auVar105);
    auVar108 = vmulps_avx512vl(auVar119,auVar119);
    auVar112 = vsubps_avx512vl(auVar100,auVar108);
    auVar118 = vmulps_avx512vl(auVar119,auVar105);
    auVar116 = vsubps_avx512vl(auVar116,auVar118);
    auVar116 = vaddps_avx512vl(auVar116,auVar116);
    auVar118 = vmulps_avx512vl(auVar105,auVar105);
    auVar117 = vsubps_avx512vl(auVar117,auVar118);
    auVar89 = vsubps_avx512vl(auVar117,auVar89);
    local_560 = vmulps_avx512vl(auVar116,auVar116);
    auVar118._8_4_ = 0x40800000;
    auVar118._0_8_ = 0x4080000040800000;
    auVar118._12_4_ = 0x40800000;
    auVar118._16_4_ = 0x40800000;
    auVar118._20_4_ = 0x40800000;
    auVar118._24_4_ = 0x40800000;
    auVar118._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar112,auVar118);
    auVar118 = vmulps_avx512vl(_local_580,auVar89);
    auVar118 = vsubps_avx512vl(local_560,auVar118);
    uVar67 = vcmpps_avx512vl(auVar118,auVar120,5);
    bVar60 = (byte)uVar67;
    fVar143 = (float)local_740._0_4_;
    fVar169 = (float)local_740._4_4_;
    fVar171 = fStack_738;
    fVar173 = fStack_734;
    fVar144 = fStack_730;
    fVar175 = fStack_72c;
    fVar177 = fStack_728;
    fVar199 = fStack_724;
    if (bVar60 == 0) {
LAB_01a797d2:
      auVar224 = ZEXT3264(_DAT_01f7b040);
      auVar244 = ZEXT3264(local_800);
      auVar250 = ZEXT3264(local_820);
      auVar252 = ZEXT3264(local_840);
      auVar241 = ZEXT3264(local_7a0);
      auVar236 = ZEXT3264(local_7c0);
      auVar243 = ZEXT3264(local_7e0);
      auVar246 = ZEXT3264(local_860);
    }
    else {
      auVar118 = vsqrtps_avx512vl(auVar118);
      auVar120 = vaddps_avx512vl(auVar112,auVar112);
      local_720 = vrcp14ps_avx512vl(auVar120);
      in_ZMM31 = ZEXT3264(local_720);
      auVar121 = vfnmadd213ps_avx512vl(local_720,auVar120,auVar254);
      auVar121 = vfmadd132ps_avx512vl(auVar121,local_720,local_720);
      auVar254._8_4_ = 0x80000000;
      auVar254._0_8_ = 0x8000000080000000;
      auVar254._12_4_ = 0x80000000;
      auVar254._16_4_ = 0x80000000;
      auVar254._20_4_ = 0x80000000;
      auVar254._24_4_ = 0x80000000;
      auVar254._28_4_ = 0x80000000;
      local_5a0 = vxorps_avx512vl(auVar116,auVar254);
      auVar122 = vsubps_avx512vl(local_5a0,auVar118);
      local_680 = vmulps_avx512vl(auVar122,auVar121);
      auVar118 = vsubps_avx512vl(auVar118,auVar116);
      local_760 = vmulps_avx512vl(auVar118,auVar121);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar121 = vblendmps_avx512vl(auVar118,local_680);
      auVar123._0_4_ =
           (uint)(bVar60 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar118._0_4_;
      bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar69 * auVar121._4_4_ | (uint)!bVar69 * auVar118._4_4_;
      bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar69 * auVar121._8_4_ | (uint)!bVar69 * auVar118._8_4_;
      bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar69 * auVar121._12_4_ | (uint)!bVar69 * auVar118._12_4_;
      bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar69 * auVar121._16_4_ | (uint)!bVar69 * auVar118._16_4_;
      bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar69 * auVar121._20_4_ | (uint)!bVar69 * auVar118._20_4_;
      bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar69 * auVar121._24_4_ | (uint)!bVar69 * auVar118._24_4_;
      bVar69 = SUB81(uVar67 >> 7,0);
      auVar123._28_4_ = (uint)bVar69 * auVar121._28_4_ | (uint)!bVar69 * auVar118._28_4_;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar118,local_760);
      auVar124._0_4_ =
           (uint)(bVar60 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar118._0_4_;
      bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar69 * auVar121._4_4_ | (uint)!bVar69 * auVar118._4_4_;
      bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar69 * auVar121._8_4_ | (uint)!bVar69 * auVar118._8_4_;
      bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar69 * auVar121._12_4_ | (uint)!bVar69 * auVar118._12_4_;
      bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar69 * auVar121._16_4_ | (uint)!bVar69 * auVar118._16_4_;
      bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar69 * auVar121._20_4_ | (uint)!bVar69 * auVar118._20_4_;
      bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar69 * auVar121._24_4_ | (uint)!bVar69 * auVar118._24_4_;
      bVar69 = SUB81(uVar67 >> 7,0);
      auVar124._28_4_ = (uint)bVar69 * auVar121._28_4_ | (uint)!bVar69 * auVar118._28_4_;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar118);
      local_5c0 = vmaxps_avx512vl(local_220,auVar118);
      auVar34._8_4_ = 0x36000000;
      auVar34._0_8_ = 0x3600000036000000;
      auVar34._12_4_ = 0x36000000;
      auVar34._16_4_ = 0x36000000;
      auVar34._20_4_ = 0x36000000;
      auVar34._24_4_ = 0x36000000;
      auVar34._28_4_ = 0x36000000;
      local_5e0 = vmulps_avx512vl(local_5c0,auVar34);
      vandps_avx512vl(auVar112,auVar118);
      uVar22 = vcmpps_avx512vl(local_5e0,local_5e0,1);
      uVar67 = uVar67 & uVar22;
      bVar66 = (byte)uVar67;
      if (bVar66 != 0) {
        uVar22 = vcmpps_avx512vl(auVar89,_DAT_01f7b000,2);
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar112 = vblendmps_avx512vl(auVar89,auVar108);
        bVar64 = (byte)uVar22;
        uVar72 = (uint)(bVar64 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar64 & 1) * local_5e0._0_4_;
        bVar69 = (bool)((byte)(uVar22 >> 1) & 1);
        uVar136 = (uint)bVar69 * auVar112._4_4_ | (uint)!bVar69 * local_5e0._4_4_;
        bVar69 = (bool)((byte)(uVar22 >> 2) & 1);
        uVar137 = (uint)bVar69 * auVar112._8_4_ | (uint)!bVar69 * local_5e0._8_4_;
        bVar69 = (bool)((byte)(uVar22 >> 3) & 1);
        uVar138 = (uint)bVar69 * auVar112._12_4_ | (uint)!bVar69 * local_5e0._12_4_;
        bVar69 = (bool)((byte)(uVar22 >> 4) & 1);
        uVar139 = (uint)bVar69 * auVar112._16_4_ | (uint)!bVar69 * local_5e0._16_4_;
        bVar69 = (bool)((byte)(uVar22 >> 5) & 1);
        uVar140 = (uint)bVar69 * auVar112._20_4_ | (uint)!bVar69 * local_5e0._20_4_;
        bVar69 = (bool)((byte)(uVar22 >> 6) & 1);
        uVar141 = (uint)bVar69 * auVar112._24_4_ | (uint)!bVar69 * local_5e0._24_4_;
        bVar69 = SUB81(uVar22 >> 7,0);
        uVar142 = (uint)bVar69 * auVar112._28_4_ | (uint)!bVar69 * local_5e0._28_4_;
        auVar123._0_4_ = (bVar66 & 1) * uVar72 | !(bool)(bVar66 & 1) * auVar123._0_4_;
        bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar123._4_4_ = bVar69 * uVar136 | !bVar69 * auVar123._4_4_;
        bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar123._8_4_ = bVar69 * uVar137 | !bVar69 * auVar123._8_4_;
        bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar123._12_4_ = bVar69 * uVar138 | !bVar69 * auVar123._12_4_;
        bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar123._16_4_ = bVar69 * uVar139 | !bVar69 * auVar123._16_4_;
        bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar123._20_4_ = bVar69 * uVar140 | !bVar69 * auVar123._20_4_;
        bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar123._24_4_ = bVar69 * uVar141 | !bVar69 * auVar123._24_4_;
        bVar69 = SUB81(uVar67 >> 7,0);
        auVar123._28_4_ = bVar69 * uVar142 | !bVar69 * auVar123._28_4_;
        auVar89 = vblendmps_avx512vl(auVar108,auVar89);
        bVar69 = (bool)((byte)(uVar22 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar22 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar22 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar22 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar22 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar22 >> 6) & 1);
        bVar19 = SUB81(uVar22 >> 7,0);
        auVar124._0_4_ =
             (uint)(bVar66 & 1) *
             ((uint)(bVar64 & 1) * auVar89._0_4_ | !(bool)(bVar64 & 1) * uVar72) |
             !(bool)(bVar66 & 1) * auVar124._0_4_;
        bVar13 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar124._4_4_ =
             (uint)bVar13 * ((uint)bVar69 * auVar89._4_4_ | !bVar69 * uVar136) |
             !bVar13 * auVar124._4_4_;
        bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar124._8_4_ =
             (uint)bVar69 * ((uint)bVar14 * auVar89._8_4_ | !bVar14 * uVar137) |
             !bVar69 * auVar124._8_4_;
        bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar124._12_4_ =
             (uint)bVar69 * ((uint)bVar15 * auVar89._12_4_ | !bVar15 * uVar138) |
             !bVar69 * auVar124._12_4_;
        bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar124._16_4_ =
             (uint)bVar69 * ((uint)bVar16 * auVar89._16_4_ | !bVar16 * uVar139) |
             !bVar69 * auVar124._16_4_;
        bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar124._20_4_ =
             (uint)bVar69 * ((uint)bVar17 * auVar89._20_4_ | !bVar17 * uVar140) |
             !bVar69 * auVar124._20_4_;
        bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar124._24_4_ =
             (uint)bVar69 * ((uint)bVar18 * auVar89._24_4_ | !bVar18 * uVar141) |
             !bVar69 * auVar124._24_4_;
        bVar69 = SUB81(uVar67 >> 7,0);
        auVar124._28_4_ =
             (uint)bVar69 * ((uint)bVar19 * auVar89._28_4_ | !bVar19 * uVar142) |
             !bVar69 * auVar124._28_4_;
        bVar60 = (~bVar66 | bVar64) & bVar60;
      }
      if ((bVar60 & 0x7f) == 0) {
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar89);
        auVar224 = ZEXT3264(_DAT_01f7b040);
        auVar244 = ZEXT3264(local_800);
        auVar250 = ZEXT3264(local_820);
        auVar252 = ZEXT3264(local_840);
        auVar241 = ZEXT3264(local_7a0);
        auVar236 = ZEXT3264(local_7c0);
        auVar243 = ZEXT3264(local_7e0);
        auVar246 = ZEXT3264(local_860);
      }
      else {
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar108 = vxorps_avx512vl(auVar111,auVar89);
        auVar109 = vxorps_avx512vl(auVar109,auVar89);
        auVar224 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        auVar110 = vxorps_avx512vl(auVar110,auVar89);
        auVar76 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                                 ZEXT416((uint)local_6e0._0_4_));
        auVar111 = vbroadcastss_avx512vl(auVar76);
        auVar111 = vminps_avx512vl(auVar111,auVar124);
        auVar59._4_4_ = fStack_23c;
        auVar59._0_4_ = local_240;
        auVar59._8_4_ = fStack_238;
        auVar59._12_4_ = fStack_234;
        auVar59._16_4_ = fStack_230;
        auVar59._20_4_ = fStack_22c;
        auVar59._24_4_ = fStack_228;
        auVar59._28_4_ = fStack_224;
        auVar112 = vmaxps_avx512vl(auVar59,auVar123);
        auVar115 = vmulps_avx512vl(auVar115,auVar125);
        auVar114 = vfmadd213ps_avx512vl(auVar114,auVar251,auVar115);
        auVar76 = vfmadd213ps_fma(auVar113,auVar247,auVar114);
        in_ZMM31 = ZEXT3264(_local_540);
        auVar113 = vmulps_avx512vl(_local_540,auVar125);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_520,auVar251);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_500,auVar247);
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar113,auVar114);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar21 = vcmpps_avx512vl(auVar114,auVar115,1);
        auVar118 = vxorps_avx512vl(ZEXT1632(auVar76),auVar89);
        auVar121 = vrcp14ps_avx512vl(auVar113);
        auVar122 = vxorps_avx512vl(auVar113,auVar89);
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar126 = vfnmadd213ps_avx512vl(auVar121,auVar113,auVar125);
        auVar76 = vfmadd132ps_fma(auVar126,auVar121,auVar121);
        fVar156 = auVar76._0_4_ * auVar118._0_4_;
        fVar170 = auVar76._4_4_ * auVar118._4_4_;
        auVar42._4_4_ = fVar170;
        auVar42._0_4_ = fVar156;
        fVar172 = auVar76._8_4_ * auVar118._8_4_;
        auVar42._8_4_ = fVar172;
        fVar174 = auVar76._12_4_ * auVar118._12_4_;
        auVar42._12_4_ = fVar174;
        fVar176 = auVar118._16_4_ * 0.0;
        auVar42._16_4_ = fVar176;
        fVar178 = auVar118._20_4_ * 0.0;
        auVar42._20_4_ = fVar178;
        fVar179 = auVar118._24_4_ * 0.0;
        auVar42._24_4_ = fVar179;
        auVar42._28_4_ = auVar118._28_4_;
        uVar24 = vcmpps_avx512vl(auVar113,auVar122,1);
        bVar66 = (byte)uVar21 | (byte)uVar24;
        auVar248._8_4_ = 0xff800000;
        auVar248._0_8_ = 0xff800000ff800000;
        auVar248._12_4_ = 0xff800000;
        auVar248._16_4_ = 0xff800000;
        auVar248._20_4_ = 0xff800000;
        auVar248._24_4_ = 0xff800000;
        auVar248._28_4_ = 0xff800000;
        auVar121 = vblendmps_avx512vl(auVar42,auVar248);
        auVar127._0_4_ = (uint)(bVar66 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar66 & 1) * -0x800000
        ;
        bVar69 = (bool)(bVar66 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar69 * auVar121._4_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)(bVar66 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar69 * auVar121._8_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)(bVar66 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar69 * auVar121._12_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)(bVar66 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar69 * auVar121._16_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)(bVar66 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar69 * auVar121._20_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)(bVar66 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar69 * auVar121._24_4_ | (uint)!bVar69 * -0x800000;
        auVar127._28_4_ =
             (uint)(bVar66 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar66 >> 7) * -0x800000;
        auVar121 = vmaxps_avx512vl(auVar112,auVar127);
        uVar24 = vcmpps_avx512vl(auVar113,auVar122,6);
        bVar66 = (byte)uVar21 | (byte)uVar24;
        auVar128._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * (int)fVar156;
        bVar69 = (bool)(bVar66 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar170;
        bVar69 = (bool)(bVar66 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar172;
        bVar69 = (bool)(bVar66 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar174;
        bVar69 = (bool)(bVar66 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar176;
        bVar69 = (bool)(bVar66 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar178;
        bVar69 = (bool)(bVar66 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar179;
        auVar128._28_4_ =
             (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar118._28_4_;
        auVar111 = vminps_avx512vl(auVar111,auVar128);
        auVar76 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar76),auVar102);
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar76),auVar103);
        auVar112 = ZEXT1632(auVar76);
        auVar104 = vsubps_avx512vl(auVar112,auVar104);
        auVar104 = vmulps_avx512vl(auVar104,auVar108);
        auVar103 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar103);
        auVar102 = vfmadd231ps_avx512vl(auVar103,auVar109,auVar102);
        auVar103 = vmulps_avx512vl(_local_540,auVar108);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_520,auVar110);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_500,auVar109);
        vandps_avx512vl(auVar103,auVar114);
        uVar21 = vcmpps_avx512vl(auVar103,auVar115,1);
        auVar102 = vxorps_avx512vl(auVar102,auVar89);
        auVar104 = vrcp14ps_avx512vl(auVar103);
        auVar89 = vxorps_avx512vl(auVar103,auVar89);
        auVar108 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar125);
        auVar76 = vfmadd132ps_fma(auVar108,auVar104,auVar104);
        fVar156 = auVar76._0_4_ * auVar102._0_4_;
        fVar170 = auVar76._4_4_ * auVar102._4_4_;
        auVar43._4_4_ = fVar170;
        auVar43._0_4_ = fVar156;
        fVar172 = auVar76._8_4_ * auVar102._8_4_;
        auVar43._8_4_ = fVar172;
        fVar174 = auVar76._12_4_ * auVar102._12_4_;
        auVar43._12_4_ = fVar174;
        fVar176 = auVar102._16_4_ * 0.0;
        auVar43._16_4_ = fVar176;
        fVar178 = auVar102._20_4_ * 0.0;
        auVar43._20_4_ = fVar178;
        fVar179 = auVar102._24_4_ * 0.0;
        auVar43._24_4_ = fVar179;
        auVar43._28_4_ = auVar102._28_4_;
        uVar24 = vcmpps_avx512vl(auVar103,auVar89,1);
        bVar66 = (byte)uVar21 | (byte)uVar24;
        auVar35._8_4_ = 0xff800000;
        auVar35._0_8_ = 0xff800000ff800000;
        auVar35._12_4_ = 0xff800000;
        auVar35._16_4_ = 0xff800000;
        auVar35._20_4_ = 0xff800000;
        auVar35._24_4_ = 0xff800000;
        auVar35._28_4_ = 0xff800000;
        auVar108 = vblendmps_avx512vl(auVar43,auVar35);
        auVar129._0_4_ =
             (uint)(bVar66 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar104._0_4_;
        bVar69 = (bool)(bVar66 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar69 * auVar108._4_4_ | (uint)!bVar69 * auVar104._4_4_;
        bVar69 = (bool)(bVar66 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar69 * auVar108._8_4_ | (uint)!bVar69 * auVar104._8_4_;
        bVar69 = (bool)(bVar66 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar69 * auVar108._12_4_ | (uint)!bVar69 * auVar104._12_4_;
        bVar69 = (bool)(bVar66 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar69 * auVar108._16_4_ | (uint)!bVar69 * auVar104._16_4_;
        bVar69 = (bool)(bVar66 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar69 * auVar108._20_4_ | (uint)!bVar69 * auVar104._20_4_;
        bVar69 = (bool)(bVar66 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar69 * auVar108._24_4_ | (uint)!bVar69 * auVar104._24_4_;
        auVar129._28_4_ =
             (uint)(bVar66 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar104._28_4_;
        local_4e0 = vmaxps_avx(auVar121,auVar129);
        uVar24 = vcmpps_avx512vl(auVar103,auVar89,6);
        bVar66 = (byte)uVar21 | (byte)uVar24;
        auVar130._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * (int)fVar156;
        bVar69 = (bool)(bVar66 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar170;
        bVar69 = (bool)(bVar66 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar172;
        bVar69 = (bool)(bVar66 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar174;
        bVar69 = (bool)(bVar66 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar176;
        bVar69 = (bool)(bVar66 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar178;
        bVar69 = (bool)(bVar66 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar179;
        auVar130._28_4_ =
             (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar102._28_4_;
        local_2a0 = vminps_avx(auVar111,auVar130);
        uVar21 = vcmpps_avx512vl(local_4e0,local_2a0,2);
        bVar60 = bVar60 & 0x7f & (byte)uVar21;
        if (bVar60 == 0) {
          auVar255 = ZEXT3264(auVar125);
          goto LAB_01a797d2;
        }
        auVar102 = vmaxps_avx512vl(auVar112,local_8a0);
        auVar89 = vfmadd213ps_avx512vl(local_680,auVar119,auVar105);
        fVar156 = auVar90._0_4_;
        fVar170 = auVar90._4_4_;
        auVar44._4_4_ = fVar170 * auVar89._4_4_;
        auVar44._0_4_ = fVar156 * auVar89._0_4_;
        fVar172 = auVar90._8_4_;
        auVar44._8_4_ = fVar172 * auVar89._8_4_;
        fVar174 = auVar90._12_4_;
        auVar44._12_4_ = fVar174 * auVar89._12_4_;
        fVar176 = auVar90._16_4_;
        auVar44._16_4_ = fVar176 * auVar89._16_4_;
        fVar178 = auVar90._20_4_;
        auVar44._20_4_ = fVar178 * auVar89._20_4_;
        fVar179 = auVar90._24_4_;
        auVar44._24_4_ = fVar179 * auVar89._24_4_;
        auVar44._28_4_ = auVar89._28_4_;
        auVar89 = vfmadd213ps_avx512vl(local_760,auVar119,auVar105);
        auVar45._4_4_ = fVar170 * auVar89._4_4_;
        auVar45._0_4_ = fVar156 * auVar89._0_4_;
        auVar45._8_4_ = fVar172 * auVar89._8_4_;
        auVar45._12_4_ = fVar174 * auVar89._12_4_;
        auVar45._16_4_ = fVar176 * auVar89._16_4_;
        auVar45._20_4_ = fVar178 * auVar89._20_4_;
        auVar45._24_4_ = fVar179 * auVar89._24_4_;
        auVar45._28_4_ = auVar89._28_4_;
        auVar89 = vminps_avx512vl(auVar44,auVar125);
        auVar52 = ZEXT812(0);
        auVar103 = ZEXT1232(auVar52) << 0x20;
        auVar89 = vmaxps_avx(auVar89,ZEXT1232(auVar52) << 0x20);
        auVar104 = vminps_avx512vl(auVar45,auVar125);
        auVar46._4_4_ = (auVar89._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar89._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar89._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar89._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar89._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar89._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar89._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar89._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar46,auVar213,auVar194);
        auVar89 = vmaxps_avx(auVar104,ZEXT1232(auVar52) << 0x20);
        auVar47._4_4_ = (auVar89._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar89._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar89._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar89._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar89._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar89._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar89._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar89._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar47,auVar213,auVar194);
        auVar48._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar48._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar48._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar48._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar48._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar48._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar48._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar48._28_4_ = auVar102._28_4_;
        auVar89 = vsubps_avx(auVar117,auVar48);
        auVar49._4_4_ = auVar89._4_4_ * (float)local_580._4_4_;
        auVar49._0_4_ = auVar89._0_4_ * (float)local_580._0_4_;
        auVar49._8_4_ = auVar89._8_4_ * fStack_578;
        auVar49._12_4_ = auVar89._12_4_ * fStack_574;
        auVar49._16_4_ = auVar89._16_4_ * fStack_570;
        auVar49._20_4_ = auVar89._20_4_ * fStack_56c;
        auVar49._24_4_ = auVar89._24_4_ * fStack_568;
        auVar49._28_4_ = auVar102._28_4_;
        auVar102 = vsubps_avx(local_560,auVar49);
        uVar21 = vcmpps_avx512vl(auVar102,ZEXT1232(auVar52) << 0x20,5);
        bVar66 = (byte)uVar21;
        if (bVar66 == 0) {
          bVar66 = 0;
          auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar236 = ZEXT864(0) << 0x20;
          auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar245 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar131._8_4_ = 0x7f800000;
          auVar131._0_8_ = 0x7f8000007f800000;
          auVar131._12_4_ = 0x7f800000;
          auVar131._16_4_ = 0x7f800000;
          auVar131._20_4_ = 0x7f800000;
          auVar131._24_4_ = 0x7f800000;
          auVar131._28_4_ = 0x7f800000;
          auVar132._8_4_ = 0xff800000;
          auVar132._0_8_ = 0xff800000ff800000;
          auVar132._12_4_ = 0xff800000;
          auVar132._16_4_ = 0xff800000;
          auVar132._20_4_ = 0xff800000;
          auVar132._24_4_ = 0xff800000;
          auVar132._28_4_ = 0xff800000;
        }
        else {
          uVar67 = vcmpps_avx512vl(auVar102,auVar112,5);
          auVar102 = vsqrtps_avx(auVar102);
          auVar103 = vfnmadd213ps_avx512vl(auVar120,local_720,auVar125);
          auVar108 = vfmadd132ps_avx512vl(auVar103,local_720,local_720);
          auVar103 = vsubps_avx(local_5a0,auVar102);
          auVar109 = vmulps_avx512vl(auVar103,auVar108);
          auVar102 = vsubps_avx512vl(auVar102,auVar116);
          auVar108 = vmulps_avx512vl(auVar102,auVar108);
          auVar102 = vfmadd213ps_avx512vl(auVar119,auVar109,auVar105);
          auVar50._4_4_ = fVar170 * auVar102._4_4_;
          auVar50._0_4_ = fVar156 * auVar102._0_4_;
          auVar50._8_4_ = fVar172 * auVar102._8_4_;
          auVar50._12_4_ = fVar174 * auVar102._12_4_;
          auVar50._16_4_ = fVar176 * auVar102._16_4_;
          auVar50._20_4_ = fVar178 * auVar102._20_4_;
          auVar50._24_4_ = fVar179 * auVar102._24_4_;
          auVar50._28_4_ = auVar104._28_4_;
          auVar102 = vmulps_avx512vl(local_500,auVar109);
          auVar103 = vmulps_avx512vl(local_520,auVar109);
          auVar110 = vmulps_avx512vl(_local_540,auVar109);
          auVar104 = vfmadd213ps_avx512vl(auVar87,auVar50,auVar221);
          auVar102 = vsubps_avx512vl(auVar102,auVar104);
          auVar104 = vfmadd213ps_avx512vl(auVar88,auVar50,auVar106);
          auVar104 = vsubps_avx512vl(auVar103,auVar104);
          auVar76 = vfmadd213ps_fma(auVar50,auVar101,auVar107);
          auVar103 = vsubps_avx(auVar110,ZEXT1632(auVar76));
          auVar245 = auVar103._0_28_;
          auVar103 = vfmadd213ps_avx512vl(auVar119,auVar108,auVar105);
          auVar105 = vmulps_avx512vl(auVar90,auVar103);
          auVar253 = ZEXT3264(auVar105);
          auVar90 = vmulps_avx512vl(local_500,auVar108);
          auVar110 = vmulps_avx512vl(local_520,auVar108);
          auVar111 = vmulps_avx512vl(_local_540,auVar108);
          auVar76 = vfmadd213ps_fma(auVar87,auVar105,auVar221);
          auVar103 = vsubps_avx(auVar90,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar88,auVar105,auVar106);
          auVar90 = vsubps_avx512vl(auVar110,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar101,auVar105,auVar107);
          auVar87 = vsubps_avx512vl(auVar111,ZEXT1632(auVar76));
          auVar236 = ZEXT3264(auVar87);
          auVar195._8_4_ = 0x7f800000;
          auVar195._0_8_ = 0x7f8000007f800000;
          auVar195._12_4_ = 0x7f800000;
          auVar195._16_4_ = 0x7f800000;
          auVar195._20_4_ = 0x7f800000;
          auVar195._24_4_ = 0x7f800000;
          auVar195._28_4_ = 0x7f800000;
          auVar87 = vblendmps_avx512vl(auVar195,auVar109);
          bVar69 = (bool)((byte)uVar67 & 1);
          auVar131._0_4_ = (uint)bVar69 * auVar87._0_4_ | (uint)!bVar69 * auVar74._0_4_;
          bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar69 * auVar87._4_4_ | (uint)!bVar69 * auVar74._4_4_;
          bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar69 * auVar87._8_4_ | (uint)!bVar69 * auVar74._8_4_;
          bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar69 * auVar87._12_4_ | (uint)!bVar69 * auVar74._12_4_;
          iVar1 = (uint)((byte)(uVar67 >> 4) & 1) * auVar87._16_4_;
          auVar131._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar67 >> 5) & 1) * auVar87._20_4_;
          auVar131._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar67 >> 6) & 1) * auVar87._24_4_;
          auVar131._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar67 >> 7) * auVar87._28_4_;
          auVar131._28_4_ = iVar4;
          auVar196._8_4_ = 0xff800000;
          auVar196._0_8_ = 0xff800000ff800000;
          auVar196._12_4_ = 0xff800000;
          auVar196._16_4_ = 0xff800000;
          auVar196._20_4_ = 0xff800000;
          auVar196._24_4_ = 0xff800000;
          auVar196._28_4_ = 0xff800000;
          auVar87 = vblendmps_avx512vl(auVar196,auVar108);
          bVar69 = (bool)((byte)uVar67 & 1);
          auVar132._0_4_ = (uint)bVar69 * auVar87._0_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar69 * auVar87._4_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar69 * auVar87._8_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar69 * auVar87._12_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar132._16_4_ = (uint)bVar69 * auVar87._16_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar132._20_4_ = (uint)bVar69 * auVar87._20_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar132._24_4_ = (uint)bVar69 * auVar87._24_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = SUB81(uVar67 >> 7,0);
          auVar132._28_4_ = (uint)bVar69 * auVar87._28_4_ | (uint)!bVar69 * -0x800000;
          auVar36._8_4_ = 0x36000000;
          auVar36._0_8_ = 0x3600000036000000;
          auVar36._12_4_ = 0x36000000;
          auVar36._16_4_ = 0x36000000;
          auVar36._20_4_ = 0x36000000;
          auVar36._24_4_ = 0x36000000;
          auVar36._28_4_ = 0x36000000;
          auVar87 = vmulps_avx512vl(local_5c0,auVar36);
          uVar22 = vcmpps_avx512vl(auVar87,local_5e0,0xe);
          uVar67 = uVar67 & uVar22;
          bVar64 = (byte)uVar67;
          if (bVar64 != 0) {
            uVar22 = vcmpps_avx512vl(auVar89,_DAT_01f7b000,2);
            auVar242._8_4_ = 0x7f800000;
            auVar242._0_8_ = 0x7f8000007f800000;
            auVar242._12_4_ = 0x7f800000;
            auVar242._16_4_ = 0x7f800000;
            auVar242._20_4_ = 0x7f800000;
            auVar242._24_4_ = 0x7f800000;
            auVar242._28_4_ = 0x7f800000;
            auVar249._8_4_ = 0xff800000;
            auVar249._0_8_ = 0xff800000ff800000;
            auVar249._12_4_ = 0xff800000;
            auVar249._16_4_ = 0xff800000;
            auVar249._20_4_ = 0xff800000;
            auVar249._24_4_ = 0xff800000;
            auVar249._28_4_ = 0xff800000;
            auVar89 = vblendmps_avx512vl(auVar242,auVar249);
            bVar61 = (byte)uVar22;
            uVar72 = (uint)(bVar61 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar87._0_4_;
            bVar69 = (bool)((byte)(uVar22 >> 1) & 1);
            uVar136 = (uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * auVar87._4_4_;
            bVar69 = (bool)((byte)(uVar22 >> 2) & 1);
            uVar137 = (uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * auVar87._8_4_;
            bVar69 = (bool)((byte)(uVar22 >> 3) & 1);
            uVar138 = (uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * auVar87._12_4_;
            bVar69 = (bool)((byte)(uVar22 >> 4) & 1);
            uVar139 = (uint)bVar69 * auVar89._16_4_ | (uint)!bVar69 * auVar87._16_4_;
            bVar69 = (bool)((byte)(uVar22 >> 5) & 1);
            uVar140 = (uint)bVar69 * auVar89._20_4_ | (uint)!bVar69 * auVar87._20_4_;
            bVar69 = (bool)((byte)(uVar22 >> 6) & 1);
            uVar141 = (uint)bVar69 * auVar89._24_4_ | (uint)!bVar69 * auVar87._24_4_;
            bVar69 = SUB81(uVar22 >> 7,0);
            uVar142 = (uint)bVar69 * auVar89._28_4_ | (uint)!bVar69 * auVar87._28_4_;
            auVar131._0_4_ = (bVar64 & 1) * uVar72 | !(bool)(bVar64 & 1) * auVar131._0_4_;
            bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar131._4_4_ = bVar69 * uVar136 | !bVar69 * auVar131._4_4_;
            bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar131._8_4_ = bVar69 * uVar137 | !bVar69 * auVar131._8_4_;
            bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar131._12_4_ = bVar69 * uVar138 | !bVar69 * auVar131._12_4_;
            bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar131._16_4_ = bVar69 * uVar139 | (uint)!bVar69 * iVar1;
            bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar131._20_4_ = bVar69 * uVar140 | (uint)!bVar69 * iVar2;
            bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar131._24_4_ = bVar69 * uVar141 | (uint)!bVar69 * iVar3;
            bVar69 = SUB81(uVar67 >> 7,0);
            auVar131._28_4_ = bVar69 * uVar142 | (uint)!bVar69 * iVar4;
            auVar89 = vblendmps_avx512vl(auVar249,auVar242);
            bVar69 = (bool)((byte)(uVar22 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar22 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar22 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar22 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar22 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar22 >> 6) & 1);
            bVar19 = SUB81(uVar22 >> 7,0);
            auVar132._0_4_ =
                 (uint)(bVar64 & 1) *
                 ((uint)(bVar61 & 1) * auVar89._0_4_ | !(bool)(bVar61 & 1) * uVar72) |
                 !(bool)(bVar64 & 1) * auVar132._0_4_;
            bVar13 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar132._4_4_ =
                 (uint)bVar13 * ((uint)bVar69 * auVar89._4_4_ | !bVar69 * uVar136) |
                 !bVar13 * auVar132._4_4_;
            bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar132._8_4_ =
                 (uint)bVar69 * ((uint)bVar14 * auVar89._8_4_ | !bVar14 * uVar137) |
                 !bVar69 * auVar132._8_4_;
            bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar132._12_4_ =
                 (uint)bVar69 * ((uint)bVar15 * auVar89._12_4_ | !bVar15 * uVar138) |
                 !bVar69 * auVar132._12_4_;
            bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar132._16_4_ =
                 (uint)bVar69 * ((uint)bVar16 * auVar89._16_4_ | !bVar16 * uVar139) |
                 !bVar69 * auVar132._16_4_;
            bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar132._20_4_ =
                 (uint)bVar69 * ((uint)bVar17 * auVar89._20_4_ | !bVar17 * uVar140) |
                 !bVar69 * auVar132._20_4_;
            bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar132._24_4_ =
                 (uint)bVar69 * ((uint)bVar18 * auVar89._24_4_ | !bVar18 * uVar141) |
                 !bVar69 * auVar132._24_4_;
            bVar69 = SUB81(uVar67 >> 7,0);
            auVar132._28_4_ =
                 (uint)bVar69 * ((uint)bVar19 * auVar89._28_4_ | !bVar19 * uVar142) |
                 !bVar69 * auVar132._28_4_;
            bVar66 = (~bVar64 | bVar61) & bVar66;
          }
        }
        auVar241._0_4_ = (float)local_540._0_4_ * auVar236._0_4_;
        auVar241._4_4_ = (float)local_540._4_4_ * auVar236._4_4_;
        auVar241._8_4_ = fStack_538 * auVar236._8_4_;
        auVar241._12_4_ = fStack_534 * auVar236._12_4_;
        auVar241._16_4_ = fStack_530 * auVar236._16_4_;
        auVar241._20_4_ = fStack_52c * auVar236._20_4_;
        auVar241._28_36_ = auVar236._28_36_;
        auVar241._24_4_ = fStack_528 * auVar236._24_4_;
        auVar76 = vfmadd231ps_fma(auVar241._0_32_,local_520,auVar90);
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_500,auVar103);
        _local_200 = local_4e0;
        local_1e0 = vminps_avx(local_2a0,auVar131);
        auVar239._8_4_ = 0x7fffffff;
        auVar239._0_8_ = 0x7fffffff7fffffff;
        auVar239._12_4_ = 0x7fffffff;
        auVar239._16_4_ = 0x7fffffff;
        auVar239._20_4_ = 0x7fffffff;
        auVar239._24_4_ = 0x7fffffff;
        auVar239._28_4_ = 0x7fffffff;
        auVar89 = vandps_avx(ZEXT1632(auVar76),auVar239);
        _local_4c0 = vmaxps_avx(local_4e0,auVar132);
        _local_2c0 = _local_4c0;
        auVar240._8_4_ = 0x3e99999a;
        auVar240._0_8_ = 0x3e99999a3e99999a;
        auVar240._12_4_ = 0x3e99999a;
        auVar240._16_4_ = 0x3e99999a;
        auVar240._20_4_ = 0x3e99999a;
        auVar240._24_4_ = 0x3e99999a;
        auVar240._28_4_ = 0x3e99999a;
        uVar21 = vcmpps_avx512vl(auVar89,auVar240,1);
        uVar24 = vcmpps_avx512vl(local_4e0,local_1e0,2);
        bVar64 = (byte)uVar24 & bVar60;
        uVar23 = vcmpps_avx512vl(_local_4c0,local_2a0,2);
        if ((bVar60 & ((byte)uVar23 | (byte)uVar24)) == 0) {
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar255 = ZEXT3264(auVar89);
          auVar224 = ZEXT3264(_DAT_01f7b040);
          auVar244 = ZEXT3264(local_800);
          auVar250 = ZEXT3264(local_820);
          auVar252 = ZEXT3264(local_840);
          auVar241 = ZEXT3264(local_7a0);
          auVar236 = ZEXT3264(local_7c0);
          auVar243 = ZEXT3264(local_7e0);
          auVar246 = ZEXT3264(local_860);
        }
        else {
          bVar61 = (byte)uVar21 | ~bVar66;
          auVar51._4_4_ = (float)local_540._4_4_ * auVar245._4_4_;
          auVar51._0_4_ = (float)local_540._0_4_ * auVar245._0_4_;
          auVar51._8_4_ = fStack_538 * auVar245._8_4_;
          auVar51._12_4_ = fStack_534 * auVar245._12_4_;
          auVar51._16_4_ = fStack_530 * auVar245._16_4_;
          auVar51._20_4_ = fStack_52c * auVar245._20_4_;
          auVar51._24_4_ = fStack_528 * auVar245._24_4_;
          auVar51._28_4_ = local_4c0._28_4_;
          auVar76 = vfmadd213ps_fma(auVar104,local_520,auVar51);
          auVar76 = vfmadd213ps_fma(auVar102,local_500,ZEXT1632(auVar76));
          auVar89 = vandps_avx(ZEXT1632(auVar76),auVar239);
          uVar21 = vcmpps_avx512vl(auVar89,auVar240,1);
          bVar66 = (byte)uVar21 | ~bVar66;
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar37._8_4_ = 3;
          auVar37._0_8_ = 0x300000003;
          auVar37._12_4_ = 3;
          auVar37._16_4_ = 3;
          auVar37._20_4_ = 3;
          auVar37._24_4_ = 3;
          auVar37._28_4_ = 3;
          auVar89 = vpblendmd_avx512vl(auVar150,auVar37);
          local_280._0_4_ = (uint)(bVar66 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
          bVar69 = (bool)(bVar66 >> 1 & 1);
          local_280._4_4_ = (uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 2 & 1);
          local_280._8_4_ = (uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 3 & 1);
          local_280._12_4_ = (uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 4 & 1);
          local_280._16_4_ = (uint)bVar69 * auVar89._16_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 5 & 1);
          local_280._20_4_ = (uint)bVar69 * auVar89._20_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 6 & 1);
          local_280._24_4_ = (uint)bVar69 * auVar89._24_4_ | (uint)!bVar69 * 2;
          local_280._28_4_ = (uint)(bVar66 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2;
          local_440 = vpbroadcastd_avx512vl();
          uVar21 = vpcmpd_avx512vl(local_440,local_280,5);
          local_4a0 = local_4e0._0_4_ + (float)local_740._0_4_;
          fStack_49c = local_4e0._4_4_ + (float)local_740._4_4_;
          fStack_498 = local_4e0._8_4_ + fStack_738;
          fStack_494 = local_4e0._12_4_ + fStack_734;
          fStack_490 = local_4e0._16_4_ + fStack_730;
          fStack_48c = local_4e0._20_4_ + fStack_72c;
          fStack_488 = local_4e0._24_4_ + fStack_728;
          fStack_484 = local_4e0._28_4_ + fStack_724;
          for (bVar66 = (byte)uVar21 & bVar64; bVar66 != 0;
              bVar66 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar66 & (byte)uVar21) {
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar89 = vblendmps_avx512vl(auVar151,local_4e0);
            auVar133._0_4_ =
                 (uint)(bVar66 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar69 * auVar89._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar69 * auVar89._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar133._24_4_ =
                 (uint)(bVar66 >> 6) * auVar89._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar89 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar89 = vminps_avx(auVar133,auVar89);
            auVar90 = vshufpd_avx(auVar89,auVar89,5);
            auVar89 = vminps_avx(auVar89,auVar90);
            auVar90 = vpermpd_avx2(auVar89,0x4e);
            auVar89 = vminps_avx(auVar89,auVar90);
            uVar21 = vcmpps_avx512vl(auVar133,auVar89,0);
            bVar62 = (byte)uVar21 & bVar66;
            bVar63 = bVar66;
            if (bVar62 != 0) {
              bVar63 = bVar62;
            }
            iVar2 = 0;
            for (uVar72 = (uint)bVar63; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar72 = *(uint *)(local_1a0 + (uint)(iVar2 << 2));
            fVar143 = auVar20._0_4_;
            auVar76 = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
            if ((float)local_780._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
              auVar253 = ZEXT1664(auVar253._0_16_);
              fVar143 = sqrtf((float)local_780._0_4_);
              auVar76 = local_8a0._0_16_;
            }
            auVar73 = vminps_avx(local_600._0_16_,local_640._0_16_);
            auVar6 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
            auVar86 = vminps_avx(local_620._0_16_,local_660._0_16_);
            auVar81 = vminps_avx(auVar73,auVar86);
            auVar73 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
            auVar86 = vmaxps_avx(auVar6,auVar73);
            auVar80._8_4_ = 0x7fffffff;
            auVar80._0_8_ = 0x7fffffff7fffffff;
            auVar80._12_4_ = 0x7fffffff;
            auVar6 = vandps_avx(auVar81,auVar80);
            auVar73 = vandps_avx(auVar86,auVar80);
            auVar6 = vmaxps_avx(auVar6,auVar73);
            auVar73 = vmovshdup_avx(auVar6);
            auVar73 = vmaxss_avx(auVar73,auVar6);
            auVar6 = vshufpd_avx(auVar6,auVar6,1);
            auVar6 = vmaxss_avx(auVar6,auVar73);
            fVar169 = auVar6._0_4_ * 1.9073486e-06;
            local_6d0 = vshufps_avx(auVar86,auVar86,0xff);
            auVar76 = vinsertps_avx(auVar76,ZEXT416(uVar72),0x10);
            auVar224 = ZEXT1664(auVar76);
            lVar68 = 5;
            do {
              do {
                bVar69 = lVar68 == 0;
                lVar68 = lVar68 + -1;
                if (bVar69) goto LAB_01a7a29c;
                fVar199 = auVar224._0_4_;
                auVar85._4_4_ = fVar199;
                auVar85._0_4_ = fVar199;
                auVar85._8_4_ = fVar199;
                auVar85._12_4_ = fVar199;
                auVar6 = vfmadd132ps_fma(auVar85,ZEXT816(0) << 0x40,local_770);
                auVar81 = auVar224._0_16_;
                auVar76 = vmovshdup_avx(auVar81);
                local_680._0_16_ = auVar76;
                fVar177 = 1.0 - auVar76._0_4_;
                auVar76 = vshufps_avx(auVar81,auVar81,0x55);
                fVar171 = auVar76._0_4_;
                auVar180._0_4_ = local_640._0_4_ * fVar171;
                fVar173 = auVar76._4_4_;
                auVar180._4_4_ = local_640._4_4_ * fVar173;
                fVar144 = auVar76._8_4_;
                auVar180._8_4_ = local_640._8_4_ * fVar144;
                fVar175 = auVar76._12_4_;
                auVar180._12_4_ = local_640._12_4_ * fVar175;
                _local_580 = ZEXT416((uint)fVar177);
                auVar200._4_4_ = fVar177;
                auVar200._0_4_ = fVar177;
                auVar200._8_4_ = fVar177;
                auVar200._12_4_ = fVar177;
                auVar76 = vfmadd231ps_fma(auVar180,auVar200,local_600._0_16_);
                auVar217._0_4_ = local_620._0_4_ * fVar171;
                auVar217._4_4_ = local_620._4_4_ * fVar173;
                auVar217._8_4_ = local_620._8_4_ * fVar144;
                auVar217._12_4_ = local_620._12_4_ * fVar175;
                auVar73 = vfmadd231ps_fma(auVar217,auVar200,local_640._0_16_);
                auVar226._0_4_ = fVar171 * (float)local_660._0_4_;
                auVar226._4_4_ = fVar173 * (float)local_660._4_4_;
                auVar226._8_4_ = fVar144 * fStack_658;
                auVar226._12_4_ = fVar175 * fStack_654;
                auVar86 = vfmadd231ps_fma(auVar226,auVar200,local_620._0_16_);
                auVar233._0_4_ = fVar171 * auVar73._0_4_;
                auVar233._4_4_ = fVar173 * auVar73._4_4_;
                auVar233._8_4_ = fVar144 * auVar73._8_4_;
                auVar233._12_4_ = fVar175 * auVar73._12_4_;
                auVar76 = vfmadd231ps_fma(auVar233,auVar200,auVar76);
                auVar181._0_4_ = fVar171 * auVar86._0_4_;
                auVar181._4_4_ = fVar173 * auVar86._4_4_;
                auVar181._8_4_ = fVar144 * auVar86._8_4_;
                auVar181._12_4_ = fVar175 * auVar86._12_4_;
                auVar73 = vfmadd231ps_fma(auVar181,auVar200,auVar73);
                auVar218._0_4_ = fVar171 * auVar73._0_4_;
                auVar218._4_4_ = fVar173 * auVar73._4_4_;
                auVar218._8_4_ = fVar144 * auVar73._8_4_;
                auVar218._12_4_ = fVar175 * auVar73._12_4_;
                auVar86 = vfmadd231ps_fma(auVar218,auVar76,auVar200);
                auVar76 = vsubps_avx(auVar73,auVar76);
                auVar84._8_4_ = 0x40400000;
                auVar84._0_8_ = 0x4040000040400000;
                auVar84._12_4_ = 0x40400000;
                auVar73 = vmulps_avx512vl(auVar76,auVar84);
                local_560._0_16_ = auVar86;
                auVar6 = vsubps_avx(auVar6,auVar86);
                auVar76 = vdpps_avx(auVar6,auVar6,0x7f);
                local_8a0._0_16_ = auVar76;
                if (auVar76._0_4_ < 0.0) {
                  auVar243._0_4_ = sqrtf(auVar76._0_4_);
                  auVar243._4_60_ = extraout_var;
                  auVar76 = auVar243._0_16_;
                }
                else {
                  auVar76 = vsqrtss_avx(auVar76,auVar76);
                }
                local_5a0._0_16_ = vdpps_avx(auVar73,auVar73,0x7f);
                fVar171 = local_5a0._0_4_;
                auVar182._4_12_ = ZEXT812(0) << 0x20;
                auVar182._0_4_ = fVar171;
                local_720._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
                fVar173 = local_720._0_4_;
                local_5c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar74 = vxorps_avx512vl(local_5a0._0_16_,auVar25);
                auVar86 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
                local_5e0._0_4_ = auVar86._0_4_;
                local_760._0_4_ = auVar76._0_4_;
                if (fVar171 < auVar74._0_4_) {
                  fVar144 = sqrtf(fVar171);
                  auVar76 = ZEXT416((uint)local_760._0_4_);
                }
                else {
                  auVar86 = vsqrtss_avx(local_5a0._0_16_,local_5a0._0_16_);
                  fVar144 = auVar86._0_4_;
                }
                fVar175 = local_720._0_4_;
                fVar171 = fVar173 * 1.5 + fVar171 * -0.5 * fVar175 * fVar175 * fVar175;
                local_720._0_4_ = auVar73._0_4_ * fVar171;
                local_720._4_4_ = auVar73._4_4_ * fVar171;
                local_720._8_4_ = auVar73._8_4_ * fVar171;
                local_720._12_4_ = auVar73._12_4_ * fVar171;
                auVar86 = vdpps_avx(auVar6,local_720._0_16_,0x7f);
                fVar177 = auVar76._0_4_;
                fVar173 = auVar86._0_4_;
                auVar145._0_4_ = fVar173 * fVar173;
                auVar145._4_4_ = auVar86._4_4_ * auVar86._4_4_;
                auVar145._8_4_ = auVar86._8_4_ * auVar86._8_4_;
                auVar145._12_4_ = auVar86._12_4_ * auVar86._12_4_;
                auVar74 = vsubps_avx(local_8a0._0_16_,auVar145);
                fVar175 = auVar74._0_4_;
                auVar158._4_12_ = ZEXT812(0) << 0x20;
                auVar158._0_4_ = fVar175;
                auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
                auVar78 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
                auVar79 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
                if (fVar175 < 0.0) {
                  local_690._0_4_ = fVar144;
                  local_6b0._0_4_ = auVar78._0_4_;
                  local_6c0._4_4_ = fVar171;
                  local_6c0._0_4_ = fVar171;
                  fStack_6b8 = fVar171;
                  fStack_6b4 = fVar171;
                  local_6a0 = auVar77;
                  fVar175 = sqrtf(fVar175);
                  auVar79 = ZEXT416(auVar79._0_4_);
                  auVar78 = ZEXT416((uint)local_6b0._0_4_);
                  auVar76 = ZEXT416((uint)local_760._0_4_);
                  auVar77 = local_6a0;
                  fVar171 = (float)local_6c0._0_4_;
                  fVar156 = (float)local_6c0._4_4_;
                  fVar170 = fStack_6b8;
                  fVar172 = fStack_6b4;
                  fVar144 = (float)local_690._0_4_;
                }
                else {
                  auVar74 = vsqrtss_avx(auVar74,auVar74);
                  fVar175 = auVar74._0_4_;
                  fVar156 = fVar171;
                  fVar170 = fVar171;
                  fVar172 = fVar171;
                }
                auVar253 = ZEXT1664(auVar86);
                auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_680._0_16_
                                         );
                auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_680._0_16_,_local_580
                                         );
                fVar174 = auVar74._0_4_ * 6.0;
                fVar176 = local_680._0_4_ * 6.0;
                auVar201._0_4_ = fVar176 * (float)local_660._0_4_;
                auVar201._4_4_ = fVar176 * (float)local_660._4_4_;
                auVar201._8_4_ = fVar176 * fStack_658;
                auVar201._12_4_ = fVar176 * fStack_654;
                auVar183._4_4_ = fVar174;
                auVar183._0_4_ = fVar174;
                auVar183._8_4_ = fVar174;
                auVar183._12_4_ = fVar174;
                auVar74 = vfmadd132ps_fma(auVar183,auVar201,local_620._0_16_);
                fVar174 = auVar82._0_4_ * 6.0;
                auVar159._4_4_ = fVar174;
                auVar159._0_4_ = fVar174;
                auVar159._8_4_ = fVar174;
                auVar159._12_4_ = fVar174;
                auVar74 = vfmadd132ps_fma(auVar159,auVar74,local_640._0_16_);
                fVar174 = local_580._0_4_ * 6.0;
                auVar184._4_4_ = fVar174;
                auVar184._0_4_ = fVar174;
                auVar184._8_4_ = fVar174;
                auVar184._12_4_ = fVar174;
                auVar74 = vfmadd132ps_fma(auVar184,auVar74,local_600._0_16_);
                auVar160._0_4_ = auVar74._0_4_ * (float)local_5a0._0_4_;
                auVar160._4_4_ = auVar74._4_4_ * (float)local_5a0._0_4_;
                auVar160._8_4_ = auVar74._8_4_ * (float)local_5a0._0_4_;
                auVar160._12_4_ = auVar74._12_4_ * (float)local_5a0._0_4_;
                auVar74 = vdpps_avx(auVar73,auVar74,0x7f);
                fVar174 = auVar74._0_4_;
                auVar185._0_4_ = auVar73._0_4_ * fVar174;
                auVar185._4_4_ = auVar73._4_4_ * fVar174;
                auVar185._8_4_ = auVar73._8_4_ * fVar174;
                auVar185._12_4_ = auVar73._12_4_ * fVar174;
                auVar74 = vsubps_avx(auVar160,auVar185);
                fVar174 = (float)local_5e0._0_4_ * (float)local_5c0._0_4_;
                auVar82 = vmaxss_avx(ZEXT416((uint)fVar169),
                                     ZEXT416((uint)(fVar199 * fVar143 * 1.9073486e-06)));
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar80 = vxorps_avx512vl(auVar73,auVar26);
                auVar186._0_4_ = fVar171 * auVar74._0_4_ * fVar174;
                auVar186._4_4_ = fVar156 * auVar74._4_4_ * fVar174;
                auVar186._8_4_ = fVar170 * auVar74._8_4_ * fVar174;
                auVar186._12_4_ = fVar172 * auVar74._12_4_ * fVar174;
                auVar74 = vdpps_avx(auVar80,local_720._0_16_,0x7f);
                auVar83 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar169),auVar82);
                auVar76 = vdpps_avx(auVar6,auVar186,0x7f);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar177 + 1.0)),
                                          ZEXT416((uint)(fVar169 / fVar144)),auVar83);
                fVar171 = auVar74._0_4_ + auVar76._0_4_;
                auVar76 = vdpps_avx(local_770,local_720._0_16_,0x7f);
                auVar74 = vdpps_avx(auVar6,auVar80,0x7f);
                auVar79 = vmulss_avx512f(auVar79,auVar77);
                auVar77 = vmulss_avx512f(auVar77,auVar77);
                auVar80 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar79._0_4_ * auVar77._0_4_)));
                auVar77 = vdpps_avx(auVar6,local_770,0x7f);
                auVar79 = vfnmadd231ss_fma(auVar74,auVar86,ZEXT416((uint)fVar171));
                auVar77 = vfnmadd231ss_fma(auVar77,auVar86,auVar76);
                auVar74 = vpermilps_avx(local_560._0_16_,0xff);
                fVar175 = fVar175 - auVar74._0_4_;
                auVar78 = vshufps_avx(auVar73,auVar73,0xff);
                auVar74 = vfmsub213ss_fma(auVar79,auVar80,auVar78);
                auVar237._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                auVar237._8_4_ = auVar74._8_4_ ^ 0x80000000;
                auVar237._12_4_ = auVar74._12_4_ ^ 0x80000000;
                auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar80._0_4_));
                auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar74._0_4_)),
                                          ZEXT416((uint)fVar171),auVar77);
                auVar74 = vinsertps_avx(auVar237,auVar77,0x1c);
                auVar227._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar227._8_4_ = auVar76._8_4_ ^ 0x80000000;
                auVar227._12_4_ = auVar76._12_4_ ^ 0x80000000;
                auVar77 = vinsertps_avx(ZEXT416((uint)fVar171),auVar227,0x10);
                auVar202._0_4_ = auVar79._0_4_;
                auVar202._4_4_ = auVar202._0_4_;
                auVar202._8_4_ = auVar202._0_4_;
                auVar202._12_4_ = auVar202._0_4_;
                auVar76 = vdivps_avx(auVar74,auVar202);
                auVar74 = vdivps_avx(auVar77,auVar202);
                auVar203._0_4_ = fVar173 * auVar76._0_4_ + fVar175 * auVar74._0_4_;
                auVar203._4_4_ = fVar173 * auVar76._4_4_ + fVar175 * auVar74._4_4_;
                auVar203._8_4_ = fVar173 * auVar76._8_4_ + fVar175 * auVar74._8_4_;
                auVar203._12_4_ = fVar173 * auVar76._12_4_ + fVar175 * auVar74._12_4_;
                auVar76 = vsubps_avx(auVar81,auVar203);
                auVar224 = ZEXT1664(auVar76);
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(auVar86,auVar27);
              } while (auVar83._0_4_ <= auVar81._0_4_);
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar82._0_4_)),local_6d0,
                                        ZEXT416(0x36000000));
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(ZEXT416((uint)fVar175),auVar28);
            } while (auVar81._0_4_ <= auVar74._0_4_);
            fVar143 = auVar76._0_4_ + (float)local_6e0._0_4_;
            if ((fVar5 <= fVar143) &&
               (fVar169 = *(float *)(ray + k * 4 + 0x100), fVar143 <= fVar169)) {
              auVar81 = vmovshdup_avx(auVar76);
              fVar171 = auVar81._0_4_;
              if ((0.0 <= fVar171) && (fVar171 <= 1.0)) {
                auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_8a0._0_4_));
                fVar173 = auVar81._0_4_;
                pGVar10 = (context->scene->geometries).items[uVar7].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar173 = fVar173 * 1.5 + local_8a0._0_4_ * -0.5 * fVar173 * fVar173 * fVar173;
                  auVar204._0_4_ = auVar6._0_4_ * fVar173;
                  auVar204._4_4_ = auVar6._4_4_ * fVar173;
                  auVar204._8_4_ = auVar6._8_4_ * fVar173;
                  auVar204._12_4_ = auVar6._12_4_ * fVar173;
                  auVar74 = vfmadd213ps_fma(auVar78,auVar204,auVar73);
                  auVar6 = vshufps_avx(auVar204,auVar204,0xc9);
                  auVar81 = vshufps_avx(auVar73,auVar73,0xc9);
                  auVar205._0_4_ = auVar204._0_4_ * auVar81._0_4_;
                  auVar205._4_4_ = auVar204._4_4_ * auVar81._4_4_;
                  auVar205._8_4_ = auVar204._8_4_ * auVar81._8_4_;
                  auVar205._12_4_ = auVar204._12_4_ * auVar81._12_4_;
                  auVar81 = vfmsub231ps_fma(auVar205,auVar73,auVar6);
                  auVar6 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar73 = vshufps_avx(auVar74,auVar74,0xc9);
                  auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                  auVar146._0_4_ = auVar74._0_4_ * auVar81._0_4_;
                  auVar146._4_4_ = auVar74._4_4_ * auVar81._4_4_;
                  auVar146._8_4_ = auVar74._8_4_ * auVar81._8_4_;
                  auVar146._12_4_ = auVar74._12_4_ * auVar81._12_4_;
                  auVar6 = vfmsub231ps_fma(auVar146,auVar6,auVar73);
                  uVar157 = auVar6._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar143;
                    uVar9 = vextractps_avx(auVar6,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                    uVar9 = vextractps_avx(auVar6,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar157;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar171;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar8;
                    *(uint *)(ray + k * 4 + 0x240) = uVar7;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar12 = context->user;
                    auVar214._8_4_ = 1;
                    auVar214._0_8_ = 0x100000001;
                    auVar214._12_4_ = 1;
                    auVar214._16_4_ = 1;
                    auVar214._20_4_ = 1;
                    auVar214._24_4_ = 1;
                    auVar214._28_4_ = 1;
                    local_380 = vpermps_avx2(auVar214,ZEXT1632(auVar76));
                    auVar89 = vpermps_avx2(auVar214,ZEXT1632(auVar6));
                    auVar222._8_4_ = 2;
                    auVar222._0_8_ = 0x200000002;
                    auVar222._12_4_ = 2;
                    auVar222._16_4_ = 2;
                    auVar222._20_4_ = 2;
                    auVar222._24_4_ = 2;
                    auVar222._28_4_ = 2;
                    local_3c0 = vpermps_avx2(auVar222,ZEXT1632(auVar6));
                    local_3e0[0] = (RTCHitN)auVar89[0];
                    local_3e0[1] = (RTCHitN)auVar89[1];
                    local_3e0[2] = (RTCHitN)auVar89[2];
                    local_3e0[3] = (RTCHitN)auVar89[3];
                    local_3e0[4] = (RTCHitN)auVar89[4];
                    local_3e0[5] = (RTCHitN)auVar89[5];
                    local_3e0[6] = (RTCHitN)auVar89[6];
                    local_3e0[7] = (RTCHitN)auVar89[7];
                    local_3e0[8] = (RTCHitN)auVar89[8];
                    local_3e0[9] = (RTCHitN)auVar89[9];
                    local_3e0[10] = (RTCHitN)auVar89[10];
                    local_3e0[0xb] = (RTCHitN)auVar89[0xb];
                    local_3e0[0xc] = (RTCHitN)auVar89[0xc];
                    local_3e0[0xd] = (RTCHitN)auVar89[0xd];
                    local_3e0[0xe] = (RTCHitN)auVar89[0xe];
                    local_3e0[0xf] = (RTCHitN)auVar89[0xf];
                    local_3e0[0x10] = (RTCHitN)auVar89[0x10];
                    local_3e0[0x11] = (RTCHitN)auVar89[0x11];
                    local_3e0[0x12] = (RTCHitN)auVar89[0x12];
                    local_3e0[0x13] = (RTCHitN)auVar89[0x13];
                    local_3e0[0x14] = (RTCHitN)auVar89[0x14];
                    local_3e0[0x15] = (RTCHitN)auVar89[0x15];
                    local_3e0[0x16] = (RTCHitN)auVar89[0x16];
                    local_3e0[0x17] = (RTCHitN)auVar89[0x17];
                    local_3e0[0x18] = (RTCHitN)auVar89[0x18];
                    local_3e0[0x19] = (RTCHitN)auVar89[0x19];
                    local_3e0[0x1a] = (RTCHitN)auVar89[0x1a];
                    local_3e0[0x1b] = (RTCHitN)auVar89[0x1b];
                    local_3e0[0x1c] = (RTCHitN)auVar89[0x1c];
                    local_3e0[0x1d] = (RTCHitN)auVar89[0x1d];
                    local_3e0[0x1e] = (RTCHitN)auVar89[0x1e];
                    local_3e0[0x1f] = (RTCHitN)auVar89[0x1f];
                    local_3a0 = uVar157;
                    uStack_39c = uVar157;
                    uStack_398 = uVar157;
                    uStack_394 = uVar157;
                    uStack_390 = uVar157;
                    uStack_38c = uVar157;
                    uStack_388 = uVar157;
                    uStack_384 = uVar157;
                    local_360 = ZEXT432(0) << 0x20;
                    local_340 = local_420._0_8_;
                    uStack_338 = local_420._8_8_;
                    uStack_330 = local_420._16_8_;
                    uStack_328 = local_420._24_8_;
                    local_320 = local_400;
                    auVar89 = vpcmpeqd_avx2(local_400,local_400);
                    local_878[1] = auVar89;
                    *local_878 = auVar89;
                    local_300 = pRVar12->instID[0];
                    uStack_2fc = local_300;
                    uStack_2f8 = local_300;
                    uStack_2f4 = local_300;
                    uStack_2f0 = local_300;
                    uStack_2ec = local_300;
                    uStack_2e8 = local_300;
                    uStack_2e4 = local_300;
                    local_2e0 = pRVar12->instPrimID[0];
                    uStack_2dc = local_2e0;
                    uStack_2d8 = local_2e0;
                    uStack_2d4 = local_2e0;
                    uStack_2d0 = local_2e0;
                    uStack_2cc = local_2e0;
                    uStack_2c8 = local_2e0;
                    uStack_2c4 = local_2e0;
                    *(float *)(ray + k * 4 + 0x100) = fVar143;
                    local_700 = local_460;
                    local_8d0.valid = (int *)local_700;
                    local_8d0.geometryUserPtr = pGVar10->userPtr;
                    local_8d0.context = context->user;
                    local_8d0.hit = local_3e0;
                    local_8d0.N = 8;
                    local_8d0.ray = (RTCRayN *)ray;
                    if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar253 = ZEXT1664(auVar86);
                      (*pGVar10->intersectionFilterN)(&local_8d0);
                    }
                    if (local_700 != (undefined1  [32])0x0) {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        (*p_Var11)(&local_8d0);
                      }
                      if (local_700 != (undefined1  [32])0x0) {
                        uVar67 = vptestmd_avx512vl(local_700,local_700);
                        iVar3 = *(int *)(local_8d0.hit + 4);
                        iVar4 = *(int *)(local_8d0.hit + 8);
                        iVar1 = *(int *)(local_8d0.hit + 0xc);
                        iVar53 = *(int *)(local_8d0.hit + 0x10);
                        iVar54 = *(int *)(local_8d0.hit + 0x14);
                        iVar55 = *(int *)(local_8d0.hit + 0x18);
                        iVar56 = *(int *)(local_8d0.hit + 0x1c);
                        bVar63 = (byte)uVar67;
                        bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar18 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x180) =
                             (uint)(bVar63 & 1) * *(int *)local_8d0.hit |
                             (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x180);
                        *(uint *)(local_8d0.ray + 0x184) =
                             (uint)bVar69 * iVar3 | (uint)!bVar69 * *(int *)(local_8d0.ray + 0x184);
                        *(uint *)(local_8d0.ray + 0x188) =
                             (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x188);
                        *(uint *)(local_8d0.ray + 0x18c) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x18c);
                        *(uint *)(local_8d0.ray + 400) =
                             (uint)bVar15 * iVar53 | (uint)!bVar15 * *(int *)(local_8d0.ray + 400);
                        *(uint *)(local_8d0.ray + 0x194) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x194)
                        ;
                        *(uint *)(local_8d0.ray + 0x198) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x198)
                        ;
                        *(uint *)(local_8d0.ray + 0x19c) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x19c)
                        ;
                        iVar3 = *(int *)(local_8d0.hit + 0x24);
                        iVar4 = *(int *)(local_8d0.hit + 0x28);
                        iVar1 = *(int *)(local_8d0.hit + 0x2c);
                        iVar53 = *(int *)(local_8d0.hit + 0x30);
                        iVar54 = *(int *)(local_8d0.hit + 0x34);
                        iVar55 = *(int *)(local_8d0.hit + 0x38);
                        iVar56 = *(int *)(local_8d0.hit + 0x3c);
                        bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar18 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1a0) =
                             (uint)(bVar63 & 1) * *(int *)(local_8d0.hit + 0x20) |
                             (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                        *(uint *)(local_8d0.ray + 0x1a4) =
                             (uint)bVar69 * iVar3 | (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1a4);
                        *(uint *)(local_8d0.ray + 0x1a8) =
                             (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1a8);
                        *(uint *)(local_8d0.ray + 0x1ac) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1ac);
                        *(uint *)(local_8d0.ray + 0x1b0) =
                             (uint)bVar15 * iVar53 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1b0)
                        ;
                        *(uint *)(local_8d0.ray + 0x1b4) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1b4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1b8) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1b8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1bc) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1bc)
                        ;
                        iVar3 = *(int *)(local_8d0.hit + 0x44);
                        iVar4 = *(int *)(local_8d0.hit + 0x48);
                        iVar1 = *(int *)(local_8d0.hit + 0x4c);
                        iVar53 = *(int *)(local_8d0.hit + 0x50);
                        iVar54 = *(int *)(local_8d0.hit + 0x54);
                        iVar55 = *(int *)(local_8d0.hit + 0x58);
                        iVar56 = *(int *)(local_8d0.hit + 0x5c);
                        bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar18 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1c0) =
                             (uint)(bVar63 & 1) * *(int *)(local_8d0.hit + 0x40) |
                             (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                        *(uint *)(local_8d0.ray + 0x1c4) =
                             (uint)bVar69 * iVar3 | (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1c4);
                        *(uint *)(local_8d0.ray + 0x1c8) =
                             (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1c8);
                        *(uint *)(local_8d0.ray + 0x1cc) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1cc);
                        *(uint *)(local_8d0.ray + 0x1d0) =
                             (uint)bVar15 * iVar53 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1d0)
                        ;
                        *(uint *)(local_8d0.ray + 0x1d4) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1d4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1d8) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1d8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1dc) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1dc)
                        ;
                        iVar3 = *(int *)(local_8d0.hit + 100);
                        iVar4 = *(int *)(local_8d0.hit + 0x68);
                        iVar1 = *(int *)(local_8d0.hit + 0x6c);
                        iVar53 = *(int *)(local_8d0.hit + 0x70);
                        iVar54 = *(int *)(local_8d0.hit + 0x74);
                        iVar55 = *(int *)(local_8d0.hit + 0x78);
                        iVar56 = *(int *)(local_8d0.hit + 0x7c);
                        bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar18 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1e0) =
                             (uint)(bVar63 & 1) * *(int *)(local_8d0.hit + 0x60) |
                             (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                        *(uint *)(local_8d0.ray + 0x1e4) =
                             (uint)bVar69 * iVar3 | (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1e4);
                        *(uint *)(local_8d0.ray + 0x1e8) =
                             (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1e8);
                        *(uint *)(local_8d0.ray + 0x1ec) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1ec);
                        *(uint *)(local_8d0.ray + 0x1f0) =
                             (uint)bVar15 * iVar53 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1f0)
                        ;
                        *(uint *)(local_8d0.ray + 500) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_8d0.ray + 500);
                        *(uint *)(local_8d0.ray + 0x1f8) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1f8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1fc) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1fc)
                        ;
                        iVar3 = *(int *)(local_8d0.hit + 0x84);
                        iVar4 = *(int *)(local_8d0.hit + 0x88);
                        iVar1 = *(int *)(local_8d0.hit + 0x8c);
                        iVar53 = *(int *)(local_8d0.hit + 0x90);
                        iVar54 = *(int *)(local_8d0.hit + 0x94);
                        iVar55 = *(int *)(local_8d0.hit + 0x98);
                        iVar56 = *(int *)(local_8d0.hit + 0x9c);
                        bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar18 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x200) =
                             (uint)(bVar63 & 1) * *(int *)(local_8d0.hit + 0x80) |
                             (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x200);
                        *(uint *)(local_8d0.ray + 0x204) =
                             (uint)bVar69 * iVar3 | (uint)!bVar69 * *(int *)(local_8d0.ray + 0x204);
                        *(uint *)(local_8d0.ray + 0x208) =
                             (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x208);
                        *(uint *)(local_8d0.ray + 0x20c) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x20c);
                        *(uint *)(local_8d0.ray + 0x210) =
                             (uint)bVar15 * iVar53 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x210)
                        ;
                        *(uint *)(local_8d0.ray + 0x214) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x214)
                        ;
                        *(uint *)(local_8d0.ray + 0x218) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x218)
                        ;
                        *(uint *)(local_8d0.ray + 0x21c) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x21c)
                        ;
                        auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar89;
                        auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar89;
                        auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar89;
                        auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0x100));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar89;
                        goto LAB_01a7a29c;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar169;
                  }
                }
              }
            }
LAB_01a7a29c:
            uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar231._4_4_ = uVar157;
            auVar231._0_4_ = uVar157;
            auVar231._8_4_ = uVar157;
            auVar231._12_4_ = uVar157;
            auVar231._16_4_ = uVar157;
            auVar231._20_4_ = uVar157;
            auVar231._24_4_ = uVar157;
            auVar231._28_4_ = uVar157;
            auVar224 = ZEXT3264(auVar231);
            auVar57._4_4_ = fStack_49c;
            auVar57._0_4_ = local_4a0;
            auVar57._8_4_ = fStack_498;
            auVar57._12_4_ = fStack_494;
            auVar57._16_4_ = fStack_490;
            auVar57._20_4_ = fStack_48c;
            auVar57._24_4_ = fStack_488;
            auVar57._28_4_ = fStack_484;
            uVar21 = vcmpps_avx512vl(auVar231,auVar57,0xd);
          }
          auVar152._0_4_ = (float)local_740._0_4_ + (float)local_4c0._0_4_;
          auVar152._4_4_ = (float)local_740._4_4_ + (float)local_4c0._4_4_;
          auVar152._8_4_ = fStack_738 + fStack_4b8;
          auVar152._12_4_ = fStack_734 + fStack_4b4;
          auVar152._16_4_ = fStack_730 + fStack_4b0;
          auVar152._20_4_ = fStack_72c + fStack_4ac;
          auVar152._24_4_ = fStack_728 + fStack_4a8;
          auVar152._28_4_ = fStack_724 + fStack_4a4;
          uVar157 = auVar224._0_4_;
          auVar165._4_4_ = uVar157;
          auVar165._0_4_ = uVar157;
          auVar165._8_4_ = uVar157;
          auVar165._12_4_ = uVar157;
          auVar165._16_4_ = uVar157;
          auVar165._20_4_ = uVar157;
          auVar165._24_4_ = uVar157;
          auVar165._28_4_ = uVar157;
          uVar21 = vcmpps_avx512vl(auVar152,auVar165,2);
          auVar153._8_4_ = 2;
          auVar153._0_8_ = 0x200000002;
          auVar153._12_4_ = 2;
          auVar153._16_4_ = 2;
          auVar153._20_4_ = 2;
          auVar153._24_4_ = 2;
          auVar153._28_4_ = 2;
          auVar38._8_4_ = 3;
          auVar38._0_8_ = 0x300000003;
          auVar38._12_4_ = 3;
          auVar38._16_4_ = 3;
          auVar38._20_4_ = 3;
          auVar38._24_4_ = 3;
          auVar38._28_4_ = 3;
          auVar89 = vpblendmd_avx512vl(auVar153,auVar38);
          local_4c0._0_4_ = (uint)(bVar61 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
          bVar69 = (bool)(bVar61 >> 1 & 1);
          local_4c0._4_4_ = (uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar61 >> 2 & 1);
          fStack_4b8 = (float)((uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * 2);
          bVar69 = (bool)(bVar61 >> 3 & 1);
          fStack_4b4 = (float)((uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * 2);
          bVar69 = (bool)(bVar61 >> 4 & 1);
          fStack_4b0 = (float)((uint)bVar69 * auVar89._16_4_ | (uint)!bVar69 * 2);
          bVar69 = (bool)(bVar61 >> 5 & 1);
          fStack_4ac = (float)((uint)bVar69 * auVar89._20_4_ | (uint)!bVar69 * 2);
          bVar69 = (bool)(bVar61 >> 6 & 1);
          fStack_4a8 = (float)((uint)bVar69 * auVar89._24_4_ | (uint)!bVar69 * 2);
          fStack_4a4 = (float)((uint)(bVar61 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2
                              );
          bVar60 = (byte)uVar23 & bVar60 & (byte)uVar21;
          uVar21 = vpcmpd_avx512vl(_local_4c0,local_440,2);
          local_4e0 = _local_2c0;
          local_4a0 = (float)local_740._0_4_ + (float)local_2c0._0_4_;
          fStack_49c = (float)local_740._4_4_ + (float)local_2c0._4_4_;
          fStack_498 = fStack_738 + fStack_2b8;
          fStack_494 = fStack_734 + fStack_2b4;
          fStack_490 = fStack_730 + fStack_2b0;
          fStack_48c = fStack_72c + fStack_2ac;
          fStack_488 = fStack_728 + fStack_2a8;
          fStack_484 = fStack_724 + fStack_2a4;
          auVar244 = ZEXT3264(local_800);
          auVar250 = ZEXT3264(local_820);
          auVar252 = ZEXT3264(local_840);
          auVar241 = ZEXT3264(local_7a0);
          auVar236 = ZEXT3264(local_7c0);
          auVar243 = ZEXT3264(local_7e0);
          auVar246 = ZEXT3264(local_860);
          for (bVar66 = (byte)uVar21 & bVar60; bVar66 != 0;
              bVar66 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar66 & (byte)uVar21) {
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar89 = vblendmps_avx512vl(auVar154,local_4e0);
            auVar134._0_4_ =
                 (uint)(bVar66 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar69 * auVar89._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar69 * auVar89._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar66 >> 6) * auVar89._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar89 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar89 = vminps_avx(auVar134,auVar89);
            auVar90 = vshufpd_avx(auVar89,auVar89,5);
            auVar89 = vminps_avx(auVar89,auVar90);
            auVar90 = vpermpd_avx2(auVar89,0x4e);
            auVar89 = vminps_avx(auVar89,auVar90);
            uVar21 = vcmpps_avx512vl(auVar134,auVar89,0);
            bVar63 = (byte)uVar21 & bVar66;
            bVar61 = bVar66;
            if (bVar63 != 0) {
              bVar61 = bVar63;
            }
            iVar2 = 0;
            for (uVar72 = (uint)bVar61; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar72 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
            fVar143 = auVar75._0_4_;
            auVar76 = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar2 << 2)));
            if ((float)local_780._0_4_ < 0.0) {
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar2 << 2)));
              auVar253 = ZEXT1664(auVar253._0_16_);
              fVar143 = sqrtf((float)local_780._0_4_);
              auVar246 = ZEXT3264(local_860);
              auVar243 = ZEXT3264(local_7e0);
              auVar236 = ZEXT3264(local_7c0);
              auVar241 = ZEXT3264(local_7a0);
              auVar252 = ZEXT3264(local_840);
              auVar250 = ZEXT3264(local_820);
              auVar244 = ZEXT3264(local_800);
              auVar76 = local_8a0._0_16_;
            }
            auVar73 = vminps_avx(local_600._0_16_,local_640._0_16_);
            auVar6 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
            auVar86 = vminps_avx(local_620._0_16_,local_660._0_16_);
            auVar81 = vminps_avx(auVar73,auVar86);
            auVar73 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
            auVar86 = vmaxps_avx(auVar6,auVar73);
            auVar206._8_4_ = 0x7fffffff;
            auVar206._0_8_ = 0x7fffffff7fffffff;
            auVar206._12_4_ = 0x7fffffff;
            auVar6 = vandps_avx(auVar81,auVar206);
            auVar73 = vandps_avx(auVar86,auVar206);
            auVar6 = vmaxps_avx(auVar6,auVar73);
            auVar73 = vmovshdup_avx(auVar6);
            auVar73 = vmaxss_avx(auVar73,auVar6);
            auVar6 = vshufpd_avx(auVar6,auVar6,1);
            auVar6 = vmaxss_avx(auVar6,auVar73);
            fVar169 = auVar6._0_4_ * 1.9073486e-06;
            local_6d0 = vshufps_avx(auVar86,auVar86,0xff);
            auVar76 = vinsertps_avx(auVar76,ZEXT416(uVar72),0x10);
            auVar224 = ZEXT1664(auVar76);
            lVar68 = 5;
            do {
              do {
                bVar69 = lVar68 == 0;
                lVar68 = lVar68 + -1;
                if (bVar69) goto LAB_01a7af5f;
                fVar199 = auVar224._0_4_;
                auVar147._4_4_ = fVar199;
                auVar147._0_4_ = fVar199;
                auVar147._8_4_ = fVar199;
                auVar147._12_4_ = fVar199;
                auVar6 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_770);
                auVar81 = auVar224._0_16_;
                auVar76 = vmovshdup_avx(auVar81);
                local_5a0._0_16_ = auVar76;
                fVar177 = 1.0 - auVar76._0_4_;
                auVar76 = vshufps_avx(auVar81,auVar81,0x55);
                fVar171 = auVar76._0_4_;
                auVar187._0_4_ = local_640._0_4_ * fVar171;
                fVar173 = auVar76._4_4_;
                auVar187._4_4_ = local_640._4_4_ * fVar173;
                fVar144 = auVar76._8_4_;
                auVar187._8_4_ = local_640._8_4_ * fVar144;
                fVar175 = auVar76._12_4_;
                auVar187._12_4_ = local_640._12_4_ * fVar175;
                _local_580 = ZEXT416((uint)fVar177);
                auVar207._4_4_ = fVar177;
                auVar207._0_4_ = fVar177;
                auVar207._8_4_ = fVar177;
                auVar207._12_4_ = fVar177;
                auVar76 = vfmadd231ps_fma(auVar187,auVar207,local_600._0_16_);
                auVar219._0_4_ = local_620._0_4_ * fVar171;
                auVar219._4_4_ = local_620._4_4_ * fVar173;
                auVar219._8_4_ = local_620._8_4_ * fVar144;
                auVar219._12_4_ = local_620._12_4_ * fVar175;
                auVar73 = vfmadd231ps_fma(auVar219,auVar207,local_640._0_16_);
                auVar228._0_4_ = fVar171 * (float)local_660._0_4_;
                auVar228._4_4_ = fVar173 * (float)local_660._4_4_;
                auVar228._8_4_ = fVar144 * fStack_658;
                auVar228._12_4_ = fVar175 * fStack_654;
                auVar86 = vfmadd231ps_fma(auVar228,auVar207,local_620._0_16_);
                auVar234._0_4_ = fVar171 * auVar73._0_4_;
                auVar234._4_4_ = fVar173 * auVar73._4_4_;
                auVar234._8_4_ = fVar144 * auVar73._8_4_;
                auVar234._12_4_ = fVar175 * auVar73._12_4_;
                auVar76 = vfmadd231ps_fma(auVar234,auVar207,auVar76);
                auVar188._0_4_ = fVar171 * auVar86._0_4_;
                auVar188._4_4_ = fVar173 * auVar86._4_4_;
                auVar188._8_4_ = fVar144 * auVar86._8_4_;
                auVar188._12_4_ = fVar175 * auVar86._12_4_;
                auVar73 = vfmadd231ps_fma(auVar188,auVar207,auVar73);
                auVar220._0_4_ = fVar171 * auVar73._0_4_;
                auVar220._4_4_ = fVar173 * auVar73._4_4_;
                auVar220._8_4_ = fVar144 * auVar73._8_4_;
                auVar220._12_4_ = fVar175 * auVar73._12_4_;
                auVar86 = vfmadd231ps_fma(auVar220,auVar76,auVar207);
                auVar76 = vsubps_avx(auVar73,auVar76);
                auVar29._8_4_ = 0x40400000;
                auVar29._0_8_ = 0x4040000040400000;
                auVar29._12_4_ = 0x40400000;
                auVar73 = vmulps_avx512vl(auVar76,auVar29);
                local_560._0_16_ = auVar86;
                auVar6 = vsubps_avx(auVar6,auVar86);
                auVar76 = vdpps_avx(auVar6,auVar6,0x7f);
                local_8a0._0_16_ = auVar76;
                if (auVar76._0_4_ < 0.0) {
                  auVar244._0_4_ = sqrtf(auVar76._0_4_);
                  auVar244._4_60_ = extraout_var_00;
                  auVar76 = auVar244._0_16_;
                }
                else {
                  auVar76 = vsqrtss_avx(auVar76,auVar76);
                }
                local_5c0._0_16_ = vdpps_avx(auVar73,auVar73,0x7f);
                fVar171 = local_5c0._0_4_;
                auVar189._4_12_ = ZEXT812(0) << 0x20;
                auVar189._0_4_ = fVar171;
                local_760._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
                fVar173 = local_760._0_4_;
                local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar74 = vxorps_avx512vl(local_5c0._0_16_,auVar30);
                auVar86 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
                local_720._0_4_ = auVar86._0_4_;
                local_680._0_4_ = auVar76._0_4_;
                if (fVar171 < auVar74._0_4_) {
                  fVar144 = sqrtf(fVar171);
                  auVar76 = ZEXT416((uint)local_680._0_4_);
                }
                else {
                  auVar86 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                  fVar144 = auVar86._0_4_;
                }
                fVar175 = local_760._0_4_;
                auVar77 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(fVar173 * 1.5 +
                                                   fVar171 * -0.5 * fVar175 * fVar175 * fVar175)));
                auVar74 = vmulps_avx512vl(auVar73,auVar77);
                local_760._0_16_ = vdpps_avx(auVar74,auVar6,0x7f);
                auVar79 = vaddss_avx512f(auVar76,ZEXT416(0x3f800000));
                auVar148._0_4_ = local_760._0_4_ * local_760._0_4_;
                auVar148._4_4_ = local_760._4_4_ * local_760._4_4_;
                auVar148._8_4_ = local_760._8_4_ * local_760._8_4_;
                auVar148._12_4_ = local_760._12_4_ * local_760._12_4_;
                auVar86 = vsubps_avx(local_8a0._0_16_,auVar148);
                fVar171 = auVar86._0_4_;
                auVar161._4_12_ = ZEXT812(0) << 0x20;
                auVar161._0_4_ = fVar171;
                auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar161);
                auVar82 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                auVar83 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                uVar71 = fVar171 == 0.0;
                uVar70 = fVar171 < 0.0;
                if ((bool)uVar70) {
                  local_6a0._0_4_ = auVar82._0_4_;
                  _local_6c0 = auVar77;
                  local_6b0 = auVar74;
                  local_690 = auVar78;
                  fVar171 = sqrtf(fVar171);
                  auVar83 = ZEXT416(auVar83._0_4_);
                  auVar82 = ZEXT416((uint)local_6a0._0_4_);
                  auVar76 = ZEXT416((uint)local_680._0_4_);
                  auVar79 = ZEXT416(auVar79._0_4_);
                  auVar74 = local_6b0;
                  auVar78 = local_690;
                  auVar77 = _local_6c0;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar171 = auVar86._0_4_;
                }
                auVar253 = ZEXT1664(auVar73);
                auVar244 = ZEXT3264(local_800);
                auVar250 = ZEXT3264(local_820);
                auVar252 = ZEXT3264(local_840);
                auVar246 = ZEXT3264(local_860);
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_
                                         );
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580
                                         );
                fVar173 = auVar86._0_4_ * 6.0;
                fVar175 = local_5a0._0_4_ * 6.0;
                auVar208._0_4_ = fVar175 * (float)local_660._0_4_;
                auVar208._4_4_ = fVar175 * (float)local_660._4_4_;
                auVar208._8_4_ = fVar175 * fStack_658;
                auVar208._12_4_ = fVar175 * fStack_654;
                auVar190._4_4_ = fVar173;
                auVar190._0_4_ = fVar173;
                auVar190._8_4_ = fVar173;
                auVar190._12_4_ = fVar173;
                auVar86 = vfmadd132ps_fma(auVar190,auVar208,local_620._0_16_);
                fVar173 = auVar80._0_4_ * 6.0;
                auVar162._4_4_ = fVar173;
                auVar162._0_4_ = fVar173;
                auVar162._8_4_ = fVar173;
                auVar162._12_4_ = fVar173;
                auVar86 = vfmadd132ps_fma(auVar162,auVar86,local_640._0_16_);
                fVar173 = local_580._0_4_ * 6.0;
                auVar191._4_4_ = fVar173;
                auVar191._0_4_ = fVar173;
                auVar191._8_4_ = fVar173;
                auVar191._12_4_ = fVar173;
                auVar86 = vfmadd132ps_fma(auVar191,auVar86,local_600._0_16_);
                auVar163._0_4_ = auVar86._0_4_ * (float)local_5c0._0_4_;
                auVar163._4_4_ = auVar86._4_4_ * (float)local_5c0._0_4_;
                auVar163._8_4_ = auVar86._8_4_ * (float)local_5c0._0_4_;
                auVar163._12_4_ = auVar86._12_4_ * (float)local_5c0._0_4_;
                auVar86 = vdpps_avx(auVar73,auVar86,0x7f);
                fVar173 = auVar86._0_4_;
                auVar192._0_4_ = auVar73._0_4_ * fVar173;
                auVar192._4_4_ = auVar73._4_4_ * fVar173;
                auVar192._8_4_ = auVar73._8_4_ * fVar173;
                auVar192._12_4_ = auVar73._12_4_ * fVar173;
                auVar86 = vsubps_avx(auVar163,auVar192);
                fVar173 = (float)local_720._0_4_ * (float)local_5e0._0_4_;
                auVar80 = vmaxss_avx(ZEXT416((uint)fVar169),
                                     ZEXT416((uint)(fVar199 * fVar143 * 1.9073486e-06)));
                auVar193._0_4_ = auVar86._0_4_ * fVar173;
                auVar193._4_4_ = auVar86._4_4_ * fVar173;
                auVar193._8_4_ = auVar86._8_4_ * fVar173;
                auVar193._12_4_ = auVar86._12_4_ * fVar173;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar84 = vxorps_avx512vl(auVar73,auVar31);
                auVar85 = vmulps_avx512vl(auVar77,auVar193);
                auVar86 = vdpps_avx(auVar84,auVar74,0x7f);
                auVar77 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar169),auVar80);
                auVar76 = vdpps_avx(auVar6,auVar85,0x7f);
                vfmadd213ss_avx512f(auVar79,ZEXT416((uint)(fVar169 / fVar144)),auVar77);
                fVar173 = auVar86._0_4_ + auVar76._0_4_;
                auVar76 = vdpps_avx(local_770,auVar74,0x7f);
                auVar86 = vdpps_avx(auVar6,auVar84,0x7f);
                auVar74 = vmulss_avx512f(auVar83,auVar78);
                auVar77 = vmulss_avx512f(auVar78,auVar78);
                auVar78 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar74._0_4_ * auVar77._0_4_)));
                auVar74 = vdpps_avx(auVar6,local_770,0x7f);
                auVar79 = vfnmadd231ss_avx512f(auVar86,local_760._0_16_,ZEXT416((uint)fVar173));
                auVar74 = vfnmadd231ss_avx512f(auVar74,local_760._0_16_,auVar76);
                auVar86 = vpermilps_avx(local_560._0_16_,0xff);
                fVar171 = fVar171 - auVar86._0_4_;
                auVar77 = vshufps_avx(auVar73,auVar73,0xff);
                auVar86 = vfmsub213ss_fma(auVar79,auVar78,auVar77);
                auVar238._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                auVar238._8_4_ = auVar86._8_4_ ^ 0x80000000;
                auVar238._12_4_ = auVar86._12_4_ ^ 0x80000000;
                auVar74 = ZEXT416((uint)(auVar74._0_4_ * auVar78._0_4_));
                auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar86._0_4_)),
                                          ZEXT416((uint)fVar173),auVar74);
                auVar86 = vinsertps_avx(auVar238,auVar74,0x1c);
                auVar229._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar229._8_4_ = auVar76._8_4_ ^ 0x80000000;
                auVar229._12_4_ = auVar76._12_4_ ^ 0x80000000;
                auVar74 = vinsertps_avx(ZEXT416((uint)fVar173),auVar229,0x10);
                auVar209._0_4_ = auVar78._0_4_;
                auVar209._4_4_ = auVar209._0_4_;
                auVar209._8_4_ = auVar209._0_4_;
                auVar209._12_4_ = auVar209._0_4_;
                auVar76 = vdivps_avx(auVar86,auVar209);
                auVar86 = vdivps_avx(auVar74,auVar209);
                auVar74 = vbroadcastss_avx512vl(local_760._0_16_);
                auVar210._0_4_ = auVar74._0_4_ * auVar76._0_4_ + fVar171 * auVar86._0_4_;
                auVar210._4_4_ = auVar74._4_4_ * auVar76._4_4_ + fVar171 * auVar86._4_4_;
                auVar210._8_4_ = auVar74._8_4_ * auVar76._8_4_ + fVar171 * auVar86._8_4_;
                auVar210._12_4_ = auVar74._12_4_ * auVar76._12_4_ + fVar171 * auVar86._12_4_;
                auVar76 = vsubps_avx(auVar81,auVar210);
                auVar224 = ZEXT1664(auVar76);
                auVar32._8_4_ = 0x7fffffff;
                auVar32._0_8_ = 0x7fffffff7fffffff;
                auVar32._12_4_ = 0x7fffffff;
                auVar86 = vandps_avx512vl(local_760._0_16_,auVar32);
                auVar86 = vucomiss_avx512f(auVar86);
                auVar241 = ZEXT3264(local_7a0);
                auVar236 = ZEXT3264(local_7c0);
                auVar243 = ZEXT3264(local_7e0);
              } while ((bool)uVar70 || (bool)uVar71);
              auVar86 = vaddss_avx512f(auVar80,auVar86);
              auVar86 = vfmadd231ss_fma(auVar86,local_6d0,ZEXT416(0x36000000));
              auVar33._8_4_ = 0x7fffffff;
              auVar33._0_8_ = 0x7fffffff7fffffff;
              auVar33._12_4_ = 0x7fffffff;
              auVar81 = vandps_avx512vl(ZEXT416((uint)fVar171),auVar33);
            } while (auVar86._0_4_ <= auVar81._0_4_);
            fVar143 = auVar76._0_4_ + (float)local_6e0._0_4_;
            if (fVar5 <= fVar143) {
              auVar86 = vucomiss_avx512f(ZEXT416((uint)fVar143));
              if (fVar5 <= fVar143) {
                auVar81 = vmovshdup_avx(auVar76);
                fVar169 = auVar81._0_4_;
                if ((0.0 <= fVar169) && (fVar169 <= 1.0)) {
                  auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_8a0._0_4_));
                  fVar171 = auVar81._0_4_;
                  pGVar10 = (context->scene->geometries).items[uVar7].ptr;
                  if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    fVar171 = fVar171 * 1.5 +
                              (float)local_8a0._0_4_ * -0.5 * fVar171 * fVar171 * fVar171;
                    local_900 = auVar6._0_4_;
                    fStack_8fc = auVar6._4_4_;
                    fStack_8f8 = auVar6._8_4_;
                    fStack_8f4 = auVar6._12_4_;
                    auVar211._0_4_ = fVar171 * local_900;
                    auVar211._4_4_ = fVar171 * fStack_8fc;
                    auVar211._8_4_ = fVar171 * fStack_8f8;
                    auVar211._12_4_ = fVar171 * fStack_8f4;
                    auVar77 = vfmadd213ps_fma(auVar77,auVar211,auVar73);
                    auVar6 = vshufps_avx(auVar211,auVar211,0xc9);
                    auVar81 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar212._0_4_ = auVar211._0_4_ * auVar81._0_4_;
                    auVar212._4_4_ = auVar211._4_4_ * auVar81._4_4_;
                    auVar212._8_4_ = auVar211._8_4_ * auVar81._8_4_;
                    auVar212._12_4_ = auVar211._12_4_ * auVar81._12_4_;
                    auVar74 = vfmsub231ps_fma(auVar212,auVar73,auVar6);
                    auVar6 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar81 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                    auVar149._0_4_ = auVar77._0_4_ * auVar74._0_4_;
                    auVar149._4_4_ = auVar77._4_4_ * auVar74._4_4_;
                    auVar149._8_4_ = auVar77._8_4_ * auVar74._8_4_;
                    auVar149._12_4_ = auVar77._12_4_ * auVar74._12_4_;
                    auVar6 = vfmsub231ps_fma(auVar149,auVar6,auVar81);
                    uVar157 = auVar6._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar143;
                      uVar9 = vextractps_avx(auVar6,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                      uVar9 = vextractps_avx(auVar6,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar157;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar169;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(uint *)(ray + k * 4 + 0x220) = uVar8;
                      *(uint *)(ray + k * 4 + 0x240) = uVar7;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar12 = context->user;
                      auVar215._8_4_ = 1;
                      auVar215._0_8_ = 0x100000001;
                      auVar215._12_4_ = 1;
                      auVar215._16_4_ = 1;
                      auVar215._20_4_ = 1;
                      auVar215._24_4_ = 1;
                      auVar215._28_4_ = 1;
                      local_380 = vpermps_avx2(auVar215,ZEXT1632(auVar76));
                      auVar89 = vpermps_avx2(auVar215,ZEXT1632(auVar6));
                      auVar223._8_4_ = 2;
                      auVar223._0_8_ = 0x200000002;
                      auVar223._12_4_ = 2;
                      auVar223._16_4_ = 2;
                      auVar223._20_4_ = 2;
                      auVar223._24_4_ = 2;
                      auVar223._28_4_ = 2;
                      local_3c0 = vpermps_avx2(auVar223,ZEXT1632(auVar6));
                      local_3e0[0] = (RTCHitN)auVar89[0];
                      local_3e0[1] = (RTCHitN)auVar89[1];
                      local_3e0[2] = (RTCHitN)auVar89[2];
                      local_3e0[3] = (RTCHitN)auVar89[3];
                      local_3e0[4] = (RTCHitN)auVar89[4];
                      local_3e0[5] = (RTCHitN)auVar89[5];
                      local_3e0[6] = (RTCHitN)auVar89[6];
                      local_3e0[7] = (RTCHitN)auVar89[7];
                      local_3e0[8] = (RTCHitN)auVar89[8];
                      local_3e0[9] = (RTCHitN)auVar89[9];
                      local_3e0[10] = (RTCHitN)auVar89[10];
                      local_3e0[0xb] = (RTCHitN)auVar89[0xb];
                      local_3e0[0xc] = (RTCHitN)auVar89[0xc];
                      local_3e0[0xd] = (RTCHitN)auVar89[0xd];
                      local_3e0[0xe] = (RTCHitN)auVar89[0xe];
                      local_3e0[0xf] = (RTCHitN)auVar89[0xf];
                      local_3e0[0x10] = (RTCHitN)auVar89[0x10];
                      local_3e0[0x11] = (RTCHitN)auVar89[0x11];
                      local_3e0[0x12] = (RTCHitN)auVar89[0x12];
                      local_3e0[0x13] = (RTCHitN)auVar89[0x13];
                      local_3e0[0x14] = (RTCHitN)auVar89[0x14];
                      local_3e0[0x15] = (RTCHitN)auVar89[0x15];
                      local_3e0[0x16] = (RTCHitN)auVar89[0x16];
                      local_3e0[0x17] = (RTCHitN)auVar89[0x17];
                      local_3e0[0x18] = (RTCHitN)auVar89[0x18];
                      local_3e0[0x19] = (RTCHitN)auVar89[0x19];
                      local_3e0[0x1a] = (RTCHitN)auVar89[0x1a];
                      local_3e0[0x1b] = (RTCHitN)auVar89[0x1b];
                      local_3e0[0x1c] = (RTCHitN)auVar89[0x1c];
                      local_3e0[0x1d] = (RTCHitN)auVar89[0x1d];
                      local_3e0[0x1e] = (RTCHitN)auVar89[0x1e];
                      local_3e0[0x1f] = (RTCHitN)auVar89[0x1f];
                      local_3a0 = uVar157;
                      uStack_39c = uVar157;
                      uStack_398 = uVar157;
                      uStack_394 = uVar157;
                      uStack_390 = uVar157;
                      uStack_38c = uVar157;
                      uStack_388 = uVar157;
                      uStack_384 = uVar157;
                      local_360 = ZEXT432(0) << 0x20;
                      local_340 = local_420._0_8_;
                      uStack_338 = local_420._8_8_;
                      uStack_330 = local_420._16_8_;
                      uStack_328 = local_420._24_8_;
                      local_320 = local_400;
                      auVar89 = vpcmpeqd_avx2(local_400,local_400);
                      local_878[1] = auVar89;
                      *local_878 = auVar89;
                      local_300 = pRVar12->instID[0];
                      uStack_2fc = local_300;
                      uStack_2f8 = local_300;
                      uStack_2f4 = local_300;
                      uStack_2f0 = local_300;
                      uStack_2ec = local_300;
                      uStack_2e8 = local_300;
                      uStack_2e4 = local_300;
                      local_2e0 = pRVar12->instPrimID[0];
                      uStack_2dc = local_2e0;
                      uStack_2d8 = local_2e0;
                      uStack_2d4 = local_2e0;
                      uStack_2d0 = local_2e0;
                      uStack_2cc = local_2e0;
                      uStack_2c8 = local_2e0;
                      uStack_2c4 = local_2e0;
                      *(float *)(ray + k * 4 + 0x100) = fVar143;
                      local_700 = local_460;
                      local_8d0.valid = (int *)local_700;
                      local_8d0.geometryUserPtr = pGVar10->userPtr;
                      local_8d0.context = context->user;
                      local_8d0.hit = local_3e0;
                      local_8d0.N = 8;
                      local_8d0.ray = (RTCRayN *)ray;
                      if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar253 = ZEXT1664(auVar73);
                        (*pGVar10->intersectionFilterN)(&local_8d0);
                        auVar246 = ZEXT3264(local_860);
                        auVar243 = ZEXT3264(local_7e0);
                        auVar236 = ZEXT3264(local_7c0);
                        auVar241 = ZEXT3264(local_7a0);
                        auVar252 = ZEXT3264(local_840);
                        auVar250 = ZEXT3264(local_820);
                        auVar244 = ZEXT3264(local_800);
                      }
                      if (local_700 != (undefined1  [32])0x0) {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar253 = ZEXT1664(auVar253._0_16_);
                          (*p_Var11)(&local_8d0);
                          auVar246 = ZEXT3264(local_860);
                          auVar243 = ZEXT3264(local_7e0);
                          auVar236 = ZEXT3264(local_7c0);
                          auVar241 = ZEXT3264(local_7a0);
                          auVar252 = ZEXT3264(local_840);
                          auVar250 = ZEXT3264(local_820);
                          auVar244 = ZEXT3264(local_800);
                        }
                        if (local_700 != (undefined1  [32])0x0) {
                          uVar67 = vptestmd_avx512vl(local_700,local_700);
                          iVar3 = *(int *)(local_8d0.hit + 4);
                          iVar4 = *(int *)(local_8d0.hit + 8);
                          iVar1 = *(int *)(local_8d0.hit + 0xc);
                          iVar53 = *(int *)(local_8d0.hit + 0x10);
                          iVar54 = *(int *)(local_8d0.hit + 0x14);
                          iVar55 = *(int *)(local_8d0.hit + 0x18);
                          iVar56 = *(int *)(local_8d0.hit + 0x1c);
                          bVar61 = (byte)uVar67;
                          bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                          bVar18 = SUB81(uVar67 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x180) =
                               (uint)(bVar61 & 1) * *(int *)local_8d0.hit |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x180);
                          *(uint *)(local_8d0.ray + 0x184) =
                               (uint)bVar69 * iVar3 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x184);
                          *(uint *)(local_8d0.ray + 0x188) =
                               (uint)bVar13 * iVar4 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x188);
                          *(uint *)(local_8d0.ray + 0x18c) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x18c);
                          *(uint *)(local_8d0.ray + 400) =
                               (uint)bVar15 * iVar53 | (uint)!bVar15 * *(int *)(local_8d0.ray + 400)
                          ;
                          *(uint *)(local_8d0.ray + 0x194) =
                               (uint)bVar16 * iVar54 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x194);
                          *(uint *)(local_8d0.ray + 0x198) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x198);
                          *(uint *)(local_8d0.ray + 0x19c) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_8d0.ray + 0x19c);
                          iVar3 = *(int *)(local_8d0.hit + 0x24);
                          iVar4 = *(int *)(local_8d0.hit + 0x28);
                          iVar1 = *(int *)(local_8d0.hit + 0x2c);
                          iVar53 = *(int *)(local_8d0.hit + 0x30);
                          iVar54 = *(int *)(local_8d0.hit + 0x34);
                          iVar55 = *(int *)(local_8d0.hit + 0x38);
                          iVar56 = *(int *)(local_8d0.hit + 0x3c);
                          bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                          bVar18 = SUB81(uVar67 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x1a0) =
                               (uint)(bVar61 & 1) * *(int *)(local_8d0.hit + 0x20) |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                          *(uint *)(local_8d0.ray + 0x1a4) =
                               (uint)bVar69 * iVar3 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1a4);
                          *(uint *)(local_8d0.ray + 0x1a8) =
                               (uint)bVar13 * iVar4 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1a8);
                          *(uint *)(local_8d0.ray + 0x1ac) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1ac);
                          *(uint *)(local_8d0.ray + 0x1b0) =
                               (uint)bVar15 * iVar53 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1b0);
                          *(uint *)(local_8d0.ray + 0x1b4) =
                               (uint)bVar16 * iVar54 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1b4);
                          *(uint *)(local_8d0.ray + 0x1b8) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1b8);
                          *(uint *)(local_8d0.ray + 0x1bc) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1bc);
                          iVar3 = *(int *)(local_8d0.hit + 0x44);
                          iVar4 = *(int *)(local_8d0.hit + 0x48);
                          iVar1 = *(int *)(local_8d0.hit + 0x4c);
                          iVar53 = *(int *)(local_8d0.hit + 0x50);
                          iVar54 = *(int *)(local_8d0.hit + 0x54);
                          iVar55 = *(int *)(local_8d0.hit + 0x58);
                          iVar56 = *(int *)(local_8d0.hit + 0x5c);
                          bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                          bVar18 = SUB81(uVar67 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x1c0) =
                               (uint)(bVar61 & 1) * *(int *)(local_8d0.hit + 0x40) |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                          *(uint *)(local_8d0.ray + 0x1c4) =
                               (uint)bVar69 * iVar3 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1c4);
                          *(uint *)(local_8d0.ray + 0x1c8) =
                               (uint)bVar13 * iVar4 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1c8);
                          *(uint *)(local_8d0.ray + 0x1cc) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1cc);
                          *(uint *)(local_8d0.ray + 0x1d0) =
                               (uint)bVar15 * iVar53 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1d0);
                          *(uint *)(local_8d0.ray + 0x1d4) =
                               (uint)bVar16 * iVar54 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1d4);
                          *(uint *)(local_8d0.ray + 0x1d8) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1d8);
                          *(uint *)(local_8d0.ray + 0x1dc) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1dc);
                          iVar3 = *(int *)(local_8d0.hit + 100);
                          iVar4 = *(int *)(local_8d0.hit + 0x68);
                          iVar1 = *(int *)(local_8d0.hit + 0x6c);
                          iVar53 = *(int *)(local_8d0.hit + 0x70);
                          iVar54 = *(int *)(local_8d0.hit + 0x74);
                          iVar55 = *(int *)(local_8d0.hit + 0x78);
                          iVar56 = *(int *)(local_8d0.hit + 0x7c);
                          bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                          bVar18 = SUB81(uVar67 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x1e0) =
                               (uint)(bVar61 & 1) * *(int *)(local_8d0.hit + 0x60) |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                          *(uint *)(local_8d0.ray + 0x1e4) =
                               (uint)bVar69 * iVar3 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1e4);
                          *(uint *)(local_8d0.ray + 0x1e8) =
                               (uint)bVar13 * iVar4 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1e8);
                          *(uint *)(local_8d0.ray + 0x1ec) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1ec);
                          *(uint *)(local_8d0.ray + 0x1f0) =
                               (uint)bVar15 * iVar53 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1f0);
                          *(uint *)(local_8d0.ray + 500) =
                               (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_8d0.ray + 500)
                          ;
                          *(uint *)(local_8d0.ray + 0x1f8) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1f8);
                          *(uint *)(local_8d0.ray + 0x1fc) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1fc);
                          iVar3 = *(int *)(local_8d0.hit + 0x84);
                          iVar4 = *(int *)(local_8d0.hit + 0x88);
                          iVar1 = *(int *)(local_8d0.hit + 0x8c);
                          iVar53 = *(int *)(local_8d0.hit + 0x90);
                          iVar54 = *(int *)(local_8d0.hit + 0x94);
                          iVar55 = *(int *)(local_8d0.hit + 0x98);
                          iVar56 = *(int *)(local_8d0.hit + 0x9c);
                          bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar67 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar67 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar67 >> 6) & 1);
                          bVar18 = SUB81(uVar67 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x200) =
                               (uint)(bVar61 & 1) * *(int *)(local_8d0.hit + 0x80) |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x200);
                          *(uint *)(local_8d0.ray + 0x204) =
                               (uint)bVar69 * iVar3 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x204);
                          *(uint *)(local_8d0.ray + 0x208) =
                               (uint)bVar13 * iVar4 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x208);
                          *(uint *)(local_8d0.ray + 0x20c) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x20c);
                          *(uint *)(local_8d0.ray + 0x210) =
                               (uint)bVar15 * iVar53 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x210);
                          *(uint *)(local_8d0.ray + 0x214) =
                               (uint)bVar16 * iVar54 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x214);
                          *(uint *)(local_8d0.ray + 0x218) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x218);
                          *(uint *)(local_8d0.ray + 0x21c) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_8d0.ray + 0x21c);
                          auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0))
                          ;
                          *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar89;
                          auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0))
                          ;
                          *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar89;
                          auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0))
                          ;
                          *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar89;
                          auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0x100)
                                                      );
                          *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar89;
                          goto LAB_01a7af5f;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x100) = auVar86._0_4_;
                    }
                  }
                }
              }
            }
LAB_01a7af5f:
            uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar232._4_4_ = uVar157;
            auVar232._0_4_ = uVar157;
            auVar232._8_4_ = uVar157;
            auVar232._12_4_ = uVar157;
            auVar232._16_4_ = uVar157;
            auVar232._20_4_ = uVar157;
            auVar232._24_4_ = uVar157;
            auVar232._28_4_ = uVar157;
            auVar224 = ZEXT3264(auVar232);
            auVar58._4_4_ = fStack_49c;
            auVar58._0_4_ = local_4a0;
            auVar58._8_4_ = fStack_498;
            auVar58._12_4_ = fStack_494;
            auVar58._16_4_ = fStack_490;
            auVar58._20_4_ = fStack_48c;
            auVar58._24_4_ = fStack_488;
            auVar58._28_4_ = fStack_484;
            uVar21 = vcmpps_avx512vl(auVar232,auVar58,0xd);
          }
          uVar24 = vpcmpd_avx512vl(local_440,local_280,1);
          uVar23 = vpcmpd_avx512vl(local_440,_local_4c0,1);
          auVar166._0_4_ = (float)local_740._0_4_ + (float)local_200._0_4_;
          auVar166._4_4_ = (float)local_740._4_4_ + (float)local_200._4_4_;
          auVar166._8_4_ = fStack_738 + fStack_1f8;
          auVar166._12_4_ = fStack_734 + fStack_1f4;
          auVar166._16_4_ = fStack_730 + fStack_1f0;
          auVar166._20_4_ = fStack_72c + fStack_1ec;
          auVar166._24_4_ = fStack_728 + fStack_1e8;
          auVar166._28_4_ = fStack_724 + fStack_1e4;
          uVar157 = auVar224._0_4_;
          auVar197._4_4_ = uVar157;
          auVar197._0_4_ = uVar157;
          auVar197._8_4_ = uVar157;
          auVar197._12_4_ = uVar157;
          auVar197._16_4_ = uVar157;
          auVar197._20_4_ = uVar157;
          auVar197._24_4_ = uVar157;
          auVar197._28_4_ = uVar157;
          uVar21 = vcmpps_avx512vl(auVar166,auVar197,2);
          bVar64 = bVar64 & (byte)uVar24 & (byte)uVar21;
          auVar216._0_4_ = (float)local_740._0_4_ + (float)local_2c0._0_4_;
          auVar216._4_4_ = (float)local_740._4_4_ + (float)local_2c0._4_4_;
          auVar216._8_4_ = fStack_738 + fStack_2b8;
          auVar216._12_4_ = fStack_734 + fStack_2b4;
          auVar216._16_4_ = fStack_730 + fStack_2b0;
          auVar216._20_4_ = fStack_72c + fStack_2ac;
          auVar216._24_4_ = fStack_728 + fStack_2a8;
          auVar216._28_4_ = fStack_724 + fStack_2a4;
          uVar21 = vcmpps_avx512vl(auVar216,auVar197,2);
          bVar60 = bVar60 & (byte)uVar23 & (byte)uVar21 | bVar64;
          if (bVar60 != 0) {
            abStack_180[uVar65 * 0x60] = bVar60;
            bVar69 = (bool)(bVar64 >> 1 & 1);
            bVar13 = (bool)(bVar64 >> 2 & 1);
            bVar14 = (bool)(bVar64 >> 3 & 1);
            bVar15 = (bool)(bVar64 >> 4 & 1);
            bVar16 = (bool)(bVar64 >> 5 & 1);
            auStack_160[uVar65 * 0x18] =
                 (uint)(bVar64 & 1) * local_200._0_4_ | (uint)!(bool)(bVar64 & 1) * local_2c0._0_4_;
            auStack_160[uVar65 * 0x18 + 1] =
                 (uint)bVar69 * local_200._4_4_ | (uint)!bVar69 * local_2c0._4_4_;
            auStack_160[uVar65 * 0x18 + 2] =
                 (uint)bVar13 * (int)fStack_1f8 | (uint)!bVar13 * (int)fStack_2b8;
            auStack_160[uVar65 * 0x18 + 3] =
                 (uint)bVar14 * (int)fStack_1f4 | (uint)!bVar14 * (int)fStack_2b4;
            auStack_160[uVar65 * 0x18 + 4] =
                 (uint)bVar15 * (int)fStack_1f0 | (uint)!bVar15 * (int)fStack_2b0;
            auStack_160[uVar65 * 0x18 + 5] =
                 (uint)bVar16 * (int)fStack_1ec | (uint)!bVar16 * (int)fStack_2ac;
            auStack_160[uVar65 * 0x18 + 6] =
                 (uint)(bVar64 >> 6) * (int)fStack_1e8 |
                 (uint)!(bool)(bVar64 >> 6) * (int)fStack_2a8;
            (&fStack_144)[uVar65 * 0x18] = fStack_2a4;
            uVar67 = vmovlps_avx(local_470);
            (&uStack_140)[uVar65 * 0xc] = uVar67;
            aiStack_138[uVar65 * 0x18] = local_ac8 + 1;
            uVar65 = (ulong)((int)uVar65 + 1);
          }
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar255 = ZEXT3264(auVar89);
          auVar224 = ZEXT3264(_DAT_01f7b040);
          prim = local_870;
          fVar143 = (float)local_740._0_4_;
          fVar169 = (float)local_740._4_4_;
          fVar171 = fStack_738;
          fVar173 = fStack_734;
          fVar144 = fStack_730;
          fVar175 = fStack_72c;
          fVar177 = fStack_728;
          fVar199 = fStack_724;
        }
      }
    }
    do {
      uVar72 = (uint)uVar65;
      uVar65 = (ulong)(uVar72 - 1);
      if (uVar72 == 0) {
        uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar40._4_4_ = uVar157;
        auVar40._0_4_ = uVar157;
        auVar40._8_4_ = uVar157;
        auVar40._12_4_ = uVar157;
        auVar40._16_4_ = uVar157;
        auVar40._20_4_ = uVar157;
        auVar40._24_4_ = uVar157;
        auVar40._28_4_ = uVar157;
        uVar21 = vcmpps_avx512vl(local_260,auVar40,2);
        local_868 = (ulong)((uint)local_868 & (uint)uVar21);
        goto LAB_01a78a7f;
      }
      auVar89 = *(undefined1 (*) [32])(auStack_160 + uVar65 * 0x18);
      auVar167._0_4_ = fVar143 + auVar89._0_4_;
      auVar167._4_4_ = fVar169 + auVar89._4_4_;
      auVar167._8_4_ = fVar171 + auVar89._8_4_;
      auVar167._12_4_ = fVar173 + auVar89._12_4_;
      auVar167._16_4_ = fVar144 + auVar89._16_4_;
      auVar167._20_4_ = fVar175 + auVar89._20_4_;
      auVar167._24_4_ = fVar177 + auVar89._24_4_;
      auVar167._28_4_ = fVar199 + auVar89._28_4_;
      uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar39._4_4_ = uVar157;
      auVar39._0_4_ = uVar157;
      auVar39._8_4_ = uVar157;
      auVar39._12_4_ = uVar157;
      auVar39._16_4_ = uVar157;
      auVar39._20_4_ = uVar157;
      auVar39._24_4_ = uVar157;
      auVar39._28_4_ = uVar157;
      uVar21 = vcmpps_avx512vl(auVar167,auVar39,2);
      uVar136 = (uint)uVar21 & (uint)abStack_180[uVar65 * 0x60];
    } while (uVar136 == 0);
    uVar67 = (&uStack_140)[uVar65 * 0xc];
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar67;
    auVar198._8_4_ = 0x7f800000;
    auVar198._0_8_ = 0x7f8000007f800000;
    auVar198._12_4_ = 0x7f800000;
    auVar198._16_4_ = 0x7f800000;
    auVar198._20_4_ = 0x7f800000;
    auVar198._24_4_ = 0x7f800000;
    auVar198._28_4_ = 0x7f800000;
    auVar90 = vblendmps_avx512vl(auVar198,auVar89);
    bVar60 = (byte)uVar136;
    auVar135._0_4_ =
         (uint)(bVar60 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar60 & 1) * (int)auVar89._0_4_;
    bVar69 = (bool)((byte)(uVar136 >> 1) & 1);
    auVar135._4_4_ = (uint)bVar69 * auVar90._4_4_ | (uint)!bVar69 * (int)auVar89._4_4_;
    bVar69 = (bool)((byte)(uVar136 >> 2) & 1);
    auVar135._8_4_ = (uint)bVar69 * auVar90._8_4_ | (uint)!bVar69 * (int)auVar89._8_4_;
    bVar69 = (bool)((byte)(uVar136 >> 3) & 1);
    auVar135._12_4_ = (uint)bVar69 * auVar90._12_4_ | (uint)!bVar69 * (int)auVar89._12_4_;
    bVar69 = (bool)((byte)(uVar136 >> 4) & 1);
    auVar135._16_4_ = (uint)bVar69 * auVar90._16_4_ | (uint)!bVar69 * (int)auVar89._16_4_;
    bVar69 = (bool)((byte)(uVar136 >> 5) & 1);
    auVar135._20_4_ = (uint)bVar69 * auVar90._20_4_ | (uint)!bVar69 * (int)auVar89._20_4_;
    bVar69 = (bool)((byte)(uVar136 >> 6) & 1);
    auVar135._24_4_ = (uint)bVar69 * auVar90._24_4_ | (uint)!bVar69 * (int)auVar89._24_4_;
    auVar135._28_4_ =
         (uVar136 >> 7) * auVar90._28_4_ | (uint)!SUB41(uVar136 >> 7,0) * (int)auVar89._28_4_;
    auVar89 = vshufps_avx(auVar135,auVar135,0xb1);
    auVar89 = vminps_avx(auVar135,auVar89);
    auVar90 = vshufpd_avx(auVar89,auVar89,5);
    auVar89 = vminps_avx(auVar89,auVar90);
    auVar90 = vpermpd_avx2(auVar89,0x4e);
    auVar89 = vminps_avx(auVar89,auVar90);
    uVar21 = vcmpps_avx512vl(auVar135,auVar89,0);
    bVar66 = (byte)uVar21 & bVar60;
    if (bVar66 != 0) {
      uVar136 = (uint)bVar66;
    }
    uVar137 = 0;
    for (; (uVar136 & 1) == 0; uVar136 = uVar136 >> 1 | 0x80000000) {
      uVar137 = uVar137 + 1;
    }
    local_ac8 = aiStack_138[uVar65 * 0x18];
    bVar60 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar60;
    abStack_180[uVar65 * 0x60] = bVar60;
    if (bVar60 == 0) {
      uVar72 = uVar72 - 1;
    }
    uVar157 = (undefined4)uVar67;
    auVar155._4_4_ = uVar157;
    auVar155._0_4_ = uVar157;
    auVar155._8_4_ = uVar157;
    auVar155._12_4_ = uVar157;
    auVar155._16_4_ = uVar157;
    auVar155._20_4_ = uVar157;
    auVar155._24_4_ = uVar157;
    auVar155._28_4_ = uVar157;
    auVar76 = vmovshdup_avx(auVar164);
    auVar76 = vsubps_avx(auVar76,auVar164);
    auVar168._0_4_ = auVar76._0_4_;
    auVar168._4_4_ = auVar168._0_4_;
    auVar168._8_4_ = auVar168._0_4_;
    auVar168._12_4_ = auVar168._0_4_;
    auVar168._16_4_ = auVar168._0_4_;
    auVar168._20_4_ = auVar168._0_4_;
    auVar168._24_4_ = auVar168._0_4_;
    auVar168._28_4_ = auVar168._0_4_;
    auVar76 = vfmadd132ps_fma(auVar168,auVar155,auVar224._0_32_);
    auVar89 = ZEXT1632(auVar76);
    local_3e0[0] = (RTCHitN)auVar89[0];
    local_3e0[1] = (RTCHitN)auVar89[1];
    local_3e0[2] = (RTCHitN)auVar89[2];
    local_3e0[3] = (RTCHitN)auVar89[3];
    local_3e0[4] = (RTCHitN)auVar89[4];
    local_3e0[5] = (RTCHitN)auVar89[5];
    local_3e0[6] = (RTCHitN)auVar89[6];
    local_3e0[7] = (RTCHitN)auVar89[7];
    local_3e0[8] = (RTCHitN)auVar89[8];
    local_3e0[9] = (RTCHitN)auVar89[9];
    local_3e0[10] = (RTCHitN)auVar89[10];
    local_3e0[0xb] = (RTCHitN)auVar89[0xb];
    local_3e0[0xc] = (RTCHitN)auVar89[0xc];
    local_3e0[0xd] = (RTCHitN)auVar89[0xd];
    local_3e0[0xe] = (RTCHitN)auVar89[0xe];
    local_3e0[0xf] = (RTCHitN)auVar89[0xf];
    local_3e0[0x10] = (RTCHitN)auVar89[0x10];
    local_3e0[0x11] = (RTCHitN)auVar89[0x11];
    local_3e0[0x12] = (RTCHitN)auVar89[0x12];
    local_3e0[0x13] = (RTCHitN)auVar89[0x13];
    local_3e0[0x14] = (RTCHitN)auVar89[0x14];
    local_3e0[0x15] = (RTCHitN)auVar89[0x15];
    local_3e0[0x16] = (RTCHitN)auVar89[0x16];
    local_3e0[0x17] = (RTCHitN)auVar89[0x17];
    local_3e0[0x18] = (RTCHitN)auVar89[0x18];
    local_3e0[0x19] = (RTCHitN)auVar89[0x19];
    local_3e0[0x1a] = (RTCHitN)auVar89[0x1a];
    local_3e0[0x1b] = (RTCHitN)auVar89[0x1b];
    local_3e0[0x1c] = (RTCHitN)auVar89[0x1c];
    local_3e0[0x1d] = (RTCHitN)auVar89[0x1d];
    local_3e0[0x1e] = (RTCHitN)auVar89[0x1e];
    local_3e0[0x1f] = (RTCHitN)auVar89[0x1f];
    local_470._8_8_ = 0;
    local_470._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar137 * 4);
    uVar65 = (ulong)uVar72;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }